

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  uint uVar9;
  int iVar10;
  undefined4 uVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  byte bVar78;
  byte bVar79;
  ulong uVar80;
  uint uVar81;
  uint uVar82;
  ulong uVar83;
  uint uVar84;
  Geometry *pGVar85;
  uint uVar86;
  long lVar87;
  ulong uVar88;
  byte bVar89;
  float fVar90;
  float fVar140;
  float fVar142;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar98 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar91;
  undefined1 auVar99 [16];
  float fVar141;
  float fVar143;
  float fVar145;
  float fVar146;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar144;
  float fVar147;
  float fVar148;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined4 uVar149;
  vint4 bi_2;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined8 uVar164;
  vint4 bi_1;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  vint4 bi;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar173;
  float fVar189;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  float fVar190;
  float fVar199;
  float fVar200;
  vint4 ai_2;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar201;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  vint4 ai;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  vint4 ai_1;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  RTCFilterFunctionNArguments local_6f0;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  Geometry *local_6b0;
  undefined1 (*local_6a8) [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined4 local_5a0;
  undefined4 uStack_59c;
  undefined8 uStack_598;
  LinearSpace3fa *local_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  uint local_500;
  uint uStack_4fc;
  uint uStack_4f8;
  uint uStack_4f4;
  uint uStack_4f0;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  float local_4e0;
  undefined1 auStack_4dc [8];
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined4 local_460;
  int local_45c;
  undefined1 local_450 [16];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  byte local_410;
  float local_400 [4];
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  int local_2c0;
  int iStack_2bc;
  int iStack_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int iStack_2a8;
  int iStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined4 uStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar214 [64];
  
  PVar8 = prim[1];
  uVar83 = (ulong)(byte)PVar8;
  fVar190 = *(float *)(prim + uVar83 * 0x19 + 0x12);
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar95 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar93 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar95 = vsubps_avx(auVar95,*(undefined1 (*) [16])(prim + uVar83 * 0x19 + 6));
  auVar174._0_4_ = fVar190 * auVar95._0_4_;
  auVar174._4_4_ = fVar190 * auVar95._4_4_;
  auVar174._8_4_ = fVar190 * auVar95._8_4_;
  auVar174._12_4_ = fVar190 * auVar95._12_4_;
  auVar150._0_4_ = fVar190 * auVar93._0_4_;
  auVar150._4_4_ = fVar190 * auVar93._4_4_;
  auVar150._8_4_ = fVar190 * auVar93._8_4_;
  auVar150._12_4_ = fVar190 * auVar93._12_4_;
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xb + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar154 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar83 + 6)));
  auVar154 = vcvtdq2ps_avx(auVar154);
  uVar88 = (ulong)(uint)((int)(uVar83 * 9) * 2);
  auVar153 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 + 6)));
  auVar153 = vcvtdq2ps_avx(auVar153);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 + uVar83 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  uVar80 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar223._4_4_ = auVar150._0_4_;
  auVar223._0_4_ = auVar150._0_4_;
  auVar223._8_4_ = auVar150._0_4_;
  auVar223._12_4_ = auVar150._0_4_;
  auVar23 = vshufps_avx(auVar150,auVar150,0x55);
  auVar94 = vshufps_avx(auVar150,auVar150,0xaa);
  fVar190 = auVar94._0_4_;
  auVar168._0_4_ = fVar190 * auVar97._0_4_;
  fVar199 = auVar94._4_4_;
  auVar168._4_4_ = fVar199 * auVar97._4_4_;
  fVar200 = auVar94._8_4_;
  auVar168._8_4_ = fVar200 * auVar97._8_4_;
  fVar201 = auVar94._12_4_;
  auVar168._12_4_ = fVar201 * auVar97._12_4_;
  auVar99._0_4_ = auVar154._0_4_ * fVar190;
  auVar99._4_4_ = auVar154._4_4_ * fVar199;
  auVar99._8_4_ = auVar154._8_4_ * fVar200;
  auVar99._12_4_ = auVar154._12_4_ * fVar201;
  auVar151._0_4_ = auVar22._0_4_ * fVar190;
  auVar151._4_4_ = auVar22._4_4_ * fVar199;
  auVar151._8_4_ = auVar22._8_4_ * fVar200;
  auVar151._12_4_ = auVar22._12_4_ * fVar201;
  auVar94 = vfmadd231ps_fma(auVar168,auVar23,auVar93);
  auVar98 = vfmadd231ps_fma(auVar99,auVar23,auVar21);
  auVar23 = vfmadd231ps_fma(auVar151,auVar96,auVar23);
  auVar92 = vfmadd231ps_fma(auVar94,auVar223,auVar95);
  auVar98 = vfmadd231ps_fma(auVar98,auVar223,auVar20);
  auVar150 = vfmadd231ps_fma(auVar23,auVar153,auVar223);
  auVar224._4_4_ = auVar174._0_4_;
  auVar224._0_4_ = auVar174._0_4_;
  auVar224._8_4_ = auVar174._0_4_;
  auVar224._12_4_ = auVar174._0_4_;
  auVar23 = vshufps_avx(auVar174,auVar174,0x55);
  auVar94 = vshufps_avx(auVar174,auVar174,0xaa);
  fVar190 = auVar94._0_4_;
  auVar225._0_4_ = fVar190 * auVar97._0_4_;
  fVar199 = auVar94._4_4_;
  auVar225._4_4_ = fVar199 * auVar97._4_4_;
  fVar200 = auVar94._8_4_;
  auVar225._8_4_ = fVar200 * auVar97._8_4_;
  fVar201 = auVar94._12_4_;
  auVar225._12_4_ = fVar201 * auVar97._12_4_;
  auVar191._0_4_ = auVar154._0_4_ * fVar190;
  auVar191._4_4_ = auVar154._4_4_ * fVar199;
  auVar191._8_4_ = auVar154._8_4_ * fVar200;
  auVar191._12_4_ = auVar154._12_4_ * fVar201;
  auVar175._0_4_ = auVar22._0_4_ * fVar190;
  auVar175._4_4_ = auVar22._4_4_ * fVar199;
  auVar175._8_4_ = auVar22._8_4_ * fVar200;
  auVar175._12_4_ = auVar22._12_4_ * fVar201;
  auVar93 = vfmadd231ps_fma(auVar225,auVar23,auVar93);
  auVar97 = vfmadd231ps_fma(auVar191,auVar23,auVar21);
  auVar21 = vfmadd231ps_fma(auVar175,auVar23,auVar96);
  auVar154 = vfmadd231ps_fma(auVar93,auVar224,auVar95);
  auVar96 = vfmadd231ps_fma(auVar97,auVar224,auVar20);
  auVar215._8_4_ = 0x7fffffff;
  auVar215._0_8_ = 0x7fffffff7fffffff;
  auVar215._12_4_ = 0x7fffffff;
  auVar22 = vfmadd231ps_fma(auVar21,auVar224,auVar153);
  auVar95 = vandps_avx(auVar92,auVar215);
  auVar211._8_4_ = 0x219392ef;
  auVar211._0_8_ = 0x219392ef219392ef;
  auVar211._12_4_ = 0x219392ef;
  uVar88 = vcmpps_avx512vl(auVar95,auVar211,1);
  bVar13 = (bool)((byte)uVar88 & 1);
  auVar94._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar92._0_4_;
  bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar92._4_4_;
  bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar92._8_4_;
  bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar92._12_4_;
  auVar95 = vandps_avx(auVar98,auVar215);
  uVar88 = vcmpps_avx512vl(auVar95,auVar211,1);
  bVar13 = (bool)((byte)uVar88 & 1);
  auVar92._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar98._0_4_;
  bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar98._4_4_;
  bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar98._8_4_;
  bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar98._12_4_;
  auVar95 = vandps_avx(auVar150,auVar215);
  uVar88 = vcmpps_avx512vl(auVar95,auVar211,1);
  bVar13 = (bool)((byte)uVar88 & 1);
  auVar98._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar150._0_4_;
  bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar150._4_4_;
  bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar150._8_4_;
  bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar150._12_4_;
  auVar93 = vrcp14ps_avx512vl(auVar94);
  auVar212._8_4_ = 0x3f800000;
  auVar212._0_8_ = &DAT_3f8000003f800000;
  auVar212._12_4_ = 0x3f800000;
  auVar95 = vfnmadd213ps_fma(auVar94,auVar93,auVar212);
  auVar20 = vfmadd132ps_fma(auVar95,auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar92);
  auVar95 = vfnmadd213ps_fma(auVar92,auVar93,auVar212);
  auVar21 = vfmadd132ps_fma(auVar95,auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar98);
  auVar95 = vfnmadd213ps_fma(auVar98,auVar93,auVar212);
  auVar153 = vfmadd132ps_fma(auVar95,auVar93,auVar93);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar95 = vpmovsxwd_avx(auVar95);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar154);
  auVar202._0_4_ = auVar20._0_4_ * auVar95._0_4_;
  auVar202._4_4_ = auVar20._4_4_ * auVar95._4_4_;
  auVar202._8_4_ = auVar20._8_4_ * auVar95._8_4_;
  auVar202._12_4_ = auVar20._12_4_ * auVar95._12_4_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar95 = vpmovsxwd_avx(auVar93);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar154);
  auVar94 = vpbroadcastd_avx512vl();
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar93 = vpmovsxwd_avx(auVar97);
  auVar169._0_4_ = auVar20._0_4_ * auVar95._0_4_;
  auVar169._4_4_ = auVar20._4_4_ * auVar95._4_4_;
  auVar169._8_4_ = auVar20._8_4_ * auVar95._8_4_;
  auVar169._12_4_ = auVar20._12_4_ * auVar95._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar83 * -2 + 6);
  auVar95 = vpmovsxwd_avx(auVar20);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar96);
  auVar213._0_4_ = auVar21._0_4_ * auVar95._0_4_;
  auVar213._4_4_ = auVar21._4_4_ * auVar95._4_4_;
  auVar213._8_4_ = auVar21._8_4_ * auVar95._8_4_;
  auVar213._12_4_ = auVar21._12_4_ * auVar95._12_4_;
  auVar214 = ZEXT1664(auVar213);
  auVar95 = vcvtdq2ps_avx(auVar93);
  auVar95 = vsubps_avx(auVar95,auVar96);
  auVar165._0_4_ = auVar21._0_4_ * auVar95._0_4_;
  auVar165._4_4_ = auVar21._4_4_ * auVar95._4_4_;
  auVar165._8_4_ = auVar21._8_4_ * auVar95._8_4_;
  auVar165._12_4_ = auVar21._12_4_ * auVar95._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar80 + uVar83 + 6);
  auVar95 = vpmovsxwd_avx(auVar21);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar22);
  auVar192._0_4_ = auVar153._0_4_ * auVar95._0_4_;
  auVar192._4_4_ = auVar153._4_4_ * auVar95._4_4_;
  auVar192._8_4_ = auVar153._8_4_ * auVar95._8_4_;
  auVar192._12_4_ = auVar153._12_4_ * auVar95._12_4_;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = *(ulong *)(prim + uVar83 * 0x17 + 6);
  auVar95 = vpmovsxwd_avx(auVar154);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar22);
  auVar152._0_4_ = auVar153._0_4_ * auVar95._0_4_;
  auVar152._4_4_ = auVar153._4_4_ * auVar95._4_4_;
  auVar152._8_4_ = auVar153._8_4_ * auVar95._8_4_;
  auVar152._12_4_ = auVar153._12_4_ * auVar95._12_4_;
  auVar95 = vpminsd_avx(auVar202,auVar169);
  auVar93 = vpminsd_avx(auVar213,auVar165);
  auVar95 = vmaxps_avx(auVar95,auVar93);
  auVar93 = vpminsd_avx(auVar192,auVar152);
  uVar149 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar153._4_4_ = uVar149;
  auVar153._0_4_ = uVar149;
  auVar153._8_4_ = uVar149;
  auVar153._12_4_ = uVar149;
  auVar93 = vmaxps_avx512vl(auVar93,auVar153);
  auVar95 = vmaxps_avx(auVar95,auVar93);
  auVar96._8_4_ = 0x3f7ffffa;
  auVar96._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar96._12_4_ = 0x3f7ffffa;
  local_310 = vmulps_avx512vl(auVar95,auVar96);
  auVar188 = ZEXT1664(local_310);
  auVar95 = vpmaxsd_avx(auVar202,auVar169);
  auVar93 = vpmaxsd_avx(auVar213,auVar165);
  auVar95 = vminps_avx(auVar95,auVar93);
  auVar93 = vpmaxsd_avx(auVar192,auVar152);
  uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar22._4_4_ = uVar149;
  auVar22._0_4_ = uVar149;
  auVar22._8_4_ = uVar149;
  auVar22._12_4_ = uVar149;
  auVar93 = vminps_avx512vl(auVar93,auVar22);
  auVar95 = vminps_avx(auVar95,auVar93);
  auVar23._8_4_ = 0x3f800003;
  auVar23._0_8_ = 0x3f8000033f800003;
  auVar23._12_4_ = 0x3f800003;
  auVar95 = vmulps_avx512vl(auVar95,auVar23);
  uVar24 = vcmpps_avx512vl(local_310,auVar95,2);
  uVar88 = vpcmpgtd_avx512vl(auVar94,_DAT_01ff0cf0);
  uVar88 = ((byte)uVar24 & 0xf) & uVar88;
  if ((char)uVar88 != '\0') {
    local_588 = pre->ray_space + k;
    local_6a8 = (undefined1 (*) [32])&local_1e0;
    local_300 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      auVar186 = auVar214._0_32_;
      auVar125 = auVar188._0_32_;
      local_620 = in_ZMM21._0_32_;
      local_600 = in_ZMM20._0_32_;
      lVar26 = 0;
      for (uVar80 = uVar88; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar86 = *(uint *)(prim + 2);
      uVar9 = *(uint *)(prim + lVar26 * 4 + 6);
      pGVar85 = (context->scene->geometries).items[uVar86].ptr;
      uVar80 = (ulong)*(uint *)(*(long *)&pGVar85->field_0x58 +
                               pGVar85[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar9);
      p_Var12 = pGVar85[1].intersectionFilterN;
      lVar26 = *(long *)&pGVar85[1].time_range.upper;
      auVar95 = *(undefined1 (*) [16])(lVar26 + (long)p_Var12 * uVar80);
      pauVar3 = (undefined1 (*) [16])(lVar26 + (uVar80 + 1) * (long)p_Var12);
      uVar24 = *(undefined8 *)*pauVar3;
      uVar65 = *(undefined8 *)(*pauVar3 + 8);
      auVar21 = *pauVar3;
      auVar93 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar26 + (uVar80 + 2) * (long)p_Var12);
      uVar66 = *(undefined8 *)*pauVar4;
      uVar67 = *(undefined8 *)(*pauVar4 + 8);
      auVar20 = *pauVar4;
      auVar97 = *pauVar4;
      uVar88 = uVar88 - 1 & uVar88;
      pauVar5 = (undefined1 (*) [12])(lVar26 + (uVar80 + 3) * (long)p_Var12);
      local_420 = *(undefined8 *)*pauVar5;
      uStack_418 = *(undefined8 *)(*pauVar5 + 8);
      local_6c0 = (float)local_420;
      fStack_6bc = (float)((ulong)local_420 >> 0x20);
      fStack_6b8 = (float)uStack_418;
      fStack_6b4 = (float)((ulong)uStack_418 >> 0x20);
      if (uVar88 != 0) {
        uVar83 = uVar88 - 1 & uVar88;
        for (uVar80 = uVar88; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
        }
        if (uVar83 != 0) {
          for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar10 = (int)pGVar85[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar154 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar154 = vinsertps_avx(auVar154,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar96 = vsubps_avx(auVar95,auVar154);
      uVar149 = auVar96._0_4_;
      auVar170._4_4_ = uVar149;
      auVar170._0_4_ = uVar149;
      auVar170._8_4_ = uVar149;
      auVar170._12_4_ = uVar149;
      auVar153 = vshufps_avx(auVar96,auVar96,0x55);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      aVar6 = (local_588->vx).field_0;
      aVar7 = (local_588->vy).field_0;
      fVar190 = (local_588->vz).field_0.m128[0];
      fVar199 = *(float *)((long)&(local_588->vz).field_0 + 4);
      fVar200 = *(float *)((long)&(local_588->vz).field_0 + 8);
      fVar201 = *(float *)((long)&(local_588->vz).field_0 + 0xc);
      auVar218._0_4_ = fVar190 * auVar96._0_4_;
      auVar218._4_4_ = fVar199 * auVar96._4_4_;
      auVar218._8_4_ = fVar200 * auVar96._8_4_;
      auVar218._12_4_ = fVar201 * auVar96._12_4_;
      auVar153 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar7,auVar153);
      auVar23 = vfmadd231ps_fma(auVar153,(undefined1  [16])aVar6,auVar170);
      auVar153 = vshufps_avx(auVar95,auVar95,0xff);
      auVar22 = vsubps_avx(auVar93,auVar154);
      uVar149 = auVar22._0_4_;
      auVar176._4_4_ = uVar149;
      auVar176._0_4_ = uVar149;
      auVar176._8_4_ = uVar149;
      auVar176._12_4_ = uVar149;
      auVar96 = vshufps_avx(auVar22,auVar22,0x55);
      auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
      auVar219._0_4_ = fVar190 * auVar22._0_4_;
      auVar219._4_4_ = fVar199 * auVar22._4_4_;
      auVar219._8_4_ = fVar200 * auVar22._8_4_;
      auVar219._12_4_ = fVar201 * auVar22._12_4_;
      auVar96 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar7,auVar96);
      auVar94 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar6,auVar176);
      auVar93 = vshufps_avx(auVar93,auVar93,0xff);
      auVar22 = vsubps_avx(auVar97,auVar154);
      uVar149 = auVar22._0_4_;
      auVar216._4_4_ = uVar149;
      auVar216._0_4_ = uVar149;
      auVar216._8_4_ = uVar149;
      auVar216._12_4_ = uVar149;
      auVar96 = vshufps_avx(auVar22,auVar22,0x55);
      auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
      auVar221._0_4_ = fVar190 * auVar22._0_4_;
      auVar221._4_4_ = fVar199 * auVar22._4_4_;
      auVar221._8_4_ = fVar200 * auVar22._8_4_;
      auVar221._12_4_ = fVar201 * auVar22._12_4_;
      auVar96 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar7,auVar96);
      auVar22 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar6,auVar216);
      auVar97 = vshufps_avx(auVar97,auVar97,0xff);
      auVar68._12_4_ = fStack_6b4;
      auVar68._0_12_ = *pauVar5;
      auVar96 = vsubps_avx512vl(auVar68,auVar154);
      uVar149 = auVar96._0_4_;
      auVar177._4_4_ = uVar149;
      auVar177._0_4_ = uVar149;
      auVar177._8_4_ = uVar149;
      auVar177._12_4_ = uVar149;
      auVar154 = vshufps_avx(auVar96,auVar96,0x55);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      auVar222._0_4_ = fVar190 * auVar96._0_4_;
      auVar222._4_4_ = fVar199 * auVar96._4_4_;
      auVar222._8_4_ = fVar200 * auVar96._8_4_;
      auVar222._12_4_ = fVar201 * auVar96._12_4_;
      auVar154 = vfmadd231ps_fma(auVar222,(undefined1  [16])aVar7,auVar154);
      auVar154 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar6,auVar177);
      lVar26 = (long)iVar10 * 0x44;
      auVar116 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26);
      auVar96 = vshufps_avx512vl(auVar68,auVar68,0xff);
      local_560 = vbroadcastss_avx512vl(auVar23);
      auVar100._8_4_ = 1;
      auVar100._0_8_ = 0x100000001;
      auVar100._12_4_ = 1;
      auVar100._16_4_ = 1;
      auVar100._20_4_ = 1;
      auVar100._24_4_ = 1;
      auVar100._28_4_ = 1;
      local_680 = vpermps_avx512vl(auVar100,ZEXT1632(auVar23));
      uVar164 = auVar153._0_8_;
      local_80._8_8_ = uVar164;
      local_80._0_8_ = uVar164;
      local_80._16_8_ = uVar164;
      local_80._24_8_ = uVar164;
      auVar117 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x484);
      uVar149 = auVar94._0_4_;
      local_6a0._4_4_ = uVar149;
      local_6a0._0_4_ = uVar149;
      local_6a0._8_4_ = uVar149;
      local_6a0._12_4_ = uVar149;
      local_6a0._16_4_ = uVar149;
      local_6a0._20_4_ = uVar149;
      local_6a0._24_4_ = uVar149;
      local_6a0._28_4_ = uVar149;
      local_2e0 = vpermps_avx512vl(auVar100,ZEXT1632(auVar94));
      uVar164 = auVar93._0_8_;
      local_a0._8_8_ = uVar164;
      local_a0._0_8_ = uVar164;
      local_a0._16_8_ = uVar164;
      local_a0._24_8_ = uVar164;
      auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x908);
      local_c0 = vbroadcastss_avx512vl(auVar22);
      local_e0 = vpermps_avx512vl(auVar100,ZEXT1632(auVar22));
      local_100 = vbroadcastsd_avx512vl(auVar97);
      auVar114 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0xd8c);
      local_640 = vbroadcastss_avx512vl(auVar154);
      auVar232 = ZEXT3264(local_640);
      local_660 = vpermps_avx512vl(auVar100,ZEXT1632(auVar154));
      auVar233 = ZEXT3264(local_660);
      _local_120 = vbroadcastsd_avx512vl(auVar96);
      auVar100 = vmulps_avx512vl(local_640,auVar114);
      auVar101 = vmulps_avx512vl(local_660,auVar114);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar115,local_c0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar115,local_e0);
      auVar93 = vfmadd231ps_fma(auVar100,auVar117,local_6a0);
      auVar102 = vfmadd231ps_avx512vl(auVar101,auVar117,local_2e0);
      auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar116,local_560);
      auVar100 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26);
      auVar101 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x484);
      auVar104 = vfmadd231ps_avx512vl(auVar102,auVar116,local_680);
      auVar102 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x908);
      auVar113 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0xd8c);
      auVar105 = vmulps_avx512vl(local_640,auVar113);
      auVar106 = vmulps_avx512vl(local_660,auVar113);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,local_c0);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar102,local_e0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar101,local_6a0);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar101,local_2e0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar100,local_560);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar100,local_680);
      auVar107 = vsubps_avx512vl(auVar105,auVar103);
      auVar108 = vsubps_avx512vl(auVar106,auVar104);
      auVar109 = vmulps_avx512vl(auVar104,auVar107);
      auVar110 = vmulps_avx512vl(auVar103,auVar108);
      auVar109 = vsubps_avx512vl(auVar109,auVar110);
      auVar110 = vmulps_avx512vl(_local_120,auVar114);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,local_100);
      auVar93 = vfmadd231ps_fma(auVar110,auVar117,local_a0);
      auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar116,local_80);
      auVar111 = vmulps_avx512vl(_local_120,auVar113);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar102,local_100);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar101,local_a0);
      auVar153 = vfmadd231ps_fma(auVar111,auVar100,local_80);
      auVar111 = vmulps_avx512vl(auVar108,auVar108);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar107,auVar107);
      auVar112 = vmaxps_avx512vl(auVar110,ZEXT1632(auVar153));
      auVar112 = vmulps_avx512vl(auVar112,auVar112);
      auVar111 = vmulps_avx512vl(auVar112,auVar111);
      auVar109 = vmulps_avx512vl(auVar109,auVar109);
      uVar164 = vcmpps_avx512vl(auVar109,auVar111,2);
      auVar93 = vblendps_avx(auVar23,auVar95,8);
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar97 = vandps_avx512vl(auVar93,auVar96);
      auVar93 = vblendps_avx(auVar94,*pauVar3,8);
      auVar93 = vandps_avx512vl(auVar93,auVar96);
      auVar97 = vmaxps_avx(auVar97,auVar93);
      auVar93 = vblendps_avx(auVar22,*pauVar4,8);
      auVar98 = vandps_avx512vl(auVar93,auVar96);
      auVar93 = vblendps_avx(auVar154,auVar68,8);
      auVar93 = vandps_avx512vl(auVar93,auVar96);
      auVar93 = vmaxps_avx(auVar98,auVar93);
      auVar93 = vmaxps_avx(auVar97,auVar93);
      auVar97 = vmovshdup_avx(auVar93);
      auVar97 = vmaxss_avx(auVar97,auVar93);
      auVar93 = vshufpd_avx(auVar93,auVar93,1);
      auVar93 = vmaxss_avx(auVar93,auVar97);
      auVar111._0_4_ = (float)iVar10;
      _auStack_4dc = auVar23._4_12_;
      auVar111._4_4_ = auVar111._0_4_;
      auVar111._8_4_ = auVar111._0_4_;
      auVar111._12_4_ = auVar111._0_4_;
      auVar111._16_4_ = auVar111._0_4_;
      auVar111._20_4_ = auVar111._0_4_;
      auVar111._24_4_ = auVar111._0_4_;
      auVar111._28_4_ = auVar111._0_4_;
      uVar25 = vcmpps_avx512vl(auVar111,_DAT_02020f40,0xe);
      bVar89 = (byte)uVar164 & (byte)uVar25;
      auVar93 = vmulss_avx512f(auVar93,ZEXT416(0x35000000));
      auVar109._8_4_ = 2;
      auVar109._0_8_ = 0x200000002;
      auVar109._12_4_ = 2;
      auVar109._16_4_ = 2;
      auVar109._20_4_ = 2;
      auVar109._24_4_ = 2;
      auVar109._28_4_ = 2;
      local_140 = vpermps_avx512vl(auVar109,ZEXT1632(auVar23));
      local_160 = vpermps_avx512vl(auVar109,ZEXT1632(auVar94));
      local_180 = vpermps_avx512vl(auVar109,ZEXT1632(auVar22));
      local_1a0 = vpermps_avx2(auVar109,ZEXT1632(auVar154));
      uVar84 = *(uint *)(ray + k * 4 + 0x60);
      auVar97 = local_c0._0_16_;
      local_4e0 = auVar111._0_4_;
      if (bVar89 == 0) {
        auVar97 = vxorps_avx512vl(auVar97,auVar97);
        auVar231 = ZEXT1664(auVar97);
        auVar214 = ZEXT3264(auVar186);
        in_ZMM20 = ZEXT3264(local_600);
        auVar188 = ZEXT3264(auVar125);
        in_ZMM21 = ZEXT3264(local_620);
        auVar230 = ZEXT3264(local_560);
        auVar229 = ZEXT3264(local_680);
        auVar228 = ZEXT3264(local_6a0);
      }
      else {
        local_580._0_16_ = ZEXT416(uVar84);
        local_540._0_16_ = auVar93;
        auVar113 = vmulps_avx512vl(local_1a0,auVar113);
        auVar102 = vfmadd213ps_avx512vl(auVar102,local_180,auVar113);
        auVar101 = vfmadd213ps_avx512vl(auVar101,local_160,auVar102);
        auVar113 = vfmadd213ps_avx512vl(auVar100,local_140,auVar101);
        auVar114 = vmulps_avx512vl(local_1a0,auVar114);
        auVar115 = vfmadd213ps_avx512vl(auVar115,local_180,auVar114);
        auVar101 = vfmadd213ps_avx512vl(auVar117,local_160,auVar115);
        auVar117 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1210);
        auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1694);
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1b18);
        auVar100 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1f9c);
        auVar109 = vfmadd213ps_avx512vl(auVar116,local_140,auVar101);
        auVar116 = vmulps_avx512vl(local_640,auVar100);
        auVar101 = vmulps_avx512vl(local_660,auVar100);
        auVar100 = vmulps_avx512vl(local_1a0,auVar100);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar114,local_c0);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar114,local_e0);
        auVar114 = vfmadd231ps_avx512vl(auVar100,local_180,auVar114);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar115,local_6a0);
        auVar100 = vfmadd231ps_avx512vl(auVar101,auVar115,local_2e0);
        auVar101 = vfmadd231ps_avx512vl(auVar114,local_160,auVar115);
        auVar102 = vfmadd231ps_avx512vl(auVar116,auVar117,local_560);
        auVar229 = ZEXT3264(local_680);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar117,local_680);
        auVar116 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1210);
        auVar115 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1b18);
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1f9c);
        auVar101 = vfmadd231ps_avx512vl(auVar101,local_140,auVar117);
        auVar117 = vmulps_avx512vl(local_640,auVar114);
        auVar112 = vmulps_avx512vl(local_660,auVar114);
        auVar114 = vmulps_avx512vl(local_1a0,auVar114);
        auVar234 = ZEXT1664(auVar93);
        auVar118 = vfmadd231ps_avx512vl(auVar117,auVar115,local_c0);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar115,local_e0);
        auVar115 = vfmadd231ps_avx512vl(auVar114,local_180,auVar115);
        auVar117 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1694);
        auVar114 = vfmadd231ps_avx512vl(auVar118,auVar117,local_6a0);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar117,local_2e0);
        auVar117 = vfmadd231ps_avx512vl(auVar115,local_160,auVar117);
        auVar115 = vfmadd231ps_avx512vl(auVar114,auVar116,local_560);
        auVar114 = vfmadd231ps_avx512vl(auVar112,auVar116,local_680);
        auVar112 = vfmadd231ps_avx512vl(auVar117,local_140,auVar116);
        auVar226._8_4_ = 0x7fffffff;
        auVar226._0_8_ = 0x7fffffff7fffffff;
        auVar226._12_4_ = 0x7fffffff;
        auVar226._16_4_ = 0x7fffffff;
        auVar226._20_4_ = 0x7fffffff;
        auVar226._24_4_ = 0x7fffffff;
        auVar226._28_4_ = 0x7fffffff;
        auVar116 = vandps_avx(auVar102,auVar226);
        auVar117 = vandps_avx(auVar100,auVar226);
        auVar117 = vmaxps_avx(auVar116,auVar117);
        auVar116 = vandps_avx(auVar101,auVar226);
        auVar116 = vmaxps_avx(auVar117,auVar116);
        auVar101 = vbroadcastss_avx512vl(auVar93);
        uVar80 = vcmpps_avx512vl(auVar116,auVar101,1);
        bVar13 = (bool)((byte)uVar80 & 1);
        auVar118._0_4_ = (float)((uint)bVar13 * auVar107._0_4_ | (uint)!bVar13 * auVar102._0_4_);
        bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * auVar102._4_4_);
        bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * auVar102._8_4_);
        bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * auVar102._12_4_);
        bVar13 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar13 * auVar107._16_4_ | (uint)!bVar13 * auVar102._16_4_);
        bVar13 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar13 * auVar107._20_4_ | (uint)!bVar13 * auVar102._20_4_);
        bVar13 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar13 * auVar107._24_4_ | (uint)!bVar13 * auVar102._24_4_);
        bVar13 = SUB81(uVar80 >> 7,0);
        auVar118._28_4_ = (uint)bVar13 * auVar107._28_4_ | (uint)!bVar13 * auVar102._28_4_;
        bVar13 = (bool)((byte)uVar80 & 1);
        auVar119._0_4_ = (float)((uint)bVar13 * auVar108._0_4_ | (uint)!bVar13 * auVar100._0_4_);
        bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar100._4_4_);
        bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar100._8_4_);
        bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar100._12_4_);
        bVar13 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar13 * auVar108._16_4_ | (uint)!bVar13 * auVar100._16_4_);
        bVar13 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar13 * auVar108._20_4_ | (uint)!bVar13 * auVar100._20_4_);
        bVar13 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar13 * auVar108._24_4_ | (uint)!bVar13 * auVar100._24_4_);
        bVar13 = SUB81(uVar80 >> 7,0);
        auVar119._28_4_ = (uint)bVar13 * auVar108._28_4_ | (uint)!bVar13 * auVar100._28_4_;
        auVar116 = vandps_avx(auVar226,auVar115);
        auVar117 = vandps_avx(auVar114,auVar226);
        auVar117 = vmaxps_avx(auVar116,auVar117);
        auVar116 = vandps_avx(auVar112,auVar226);
        auVar116 = vmaxps_avx(auVar117,auVar116);
        uVar80 = vcmpps_avx512vl(auVar116,auVar101,1);
        bVar13 = (bool)((byte)uVar80 & 1);
        auVar112._0_4_ = (float)((uint)bVar13 * auVar107._0_4_ | (uint)!bVar13 * auVar115._0_4_);
        bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * auVar115._4_4_);
        bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * auVar115._8_4_);
        bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * auVar115._12_4_);
        bVar13 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar112._16_4_ = (float)((uint)bVar13 * auVar107._16_4_ | (uint)!bVar13 * auVar115._16_4_);
        bVar13 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar112._20_4_ = (float)((uint)bVar13 * auVar107._20_4_ | (uint)!bVar13 * auVar115._20_4_);
        bVar13 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar112._24_4_ = (float)((uint)bVar13 * auVar107._24_4_ | (uint)!bVar13 * auVar115._24_4_);
        bVar13 = SUB81(uVar80 >> 7,0);
        auVar112._28_4_ = (uint)bVar13 * auVar107._28_4_ | (uint)!bVar13 * auVar115._28_4_;
        bVar13 = (bool)((byte)uVar80 & 1);
        auVar107._0_4_ = (float)((uint)bVar13 * auVar108._0_4_ | (uint)!bVar13 * auVar114._0_4_);
        bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar114._4_4_);
        bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar114._8_4_);
        bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar114._12_4_);
        bVar13 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar13 * auVar108._16_4_ | (uint)!bVar13 * auVar114._16_4_);
        bVar13 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar13 * auVar108._20_4_ | (uint)!bVar13 * auVar114._20_4_);
        bVar13 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar13 * auVar108._24_4_ | (uint)!bVar13 * auVar114._24_4_);
        bVar13 = SUB81(uVar80 >> 7,0);
        auVar107._28_4_ = (uint)bVar13 * auVar108._28_4_ | (uint)!bVar13 * auVar114._28_4_;
        auVar99 = vxorps_avx512vl(auVar97,auVar97);
        auVar231 = ZEXT1664(auVar99);
        auVar116 = vfmadd213ps_avx512vl(auVar118,auVar118,ZEXT1632(auVar99));
        auVar97 = vfmadd231ps_fma(auVar116,auVar119,auVar119);
        auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar97));
        fVar190 = auVar115._0_4_;
        fVar199 = auVar115._4_4_;
        fVar200 = auVar115._8_4_;
        fVar201 = auVar115._12_4_;
        fVar173 = auVar115._16_4_;
        fVar189 = auVar115._20_4_;
        fVar90 = auVar115._24_4_;
        auVar116._4_4_ = fVar199 * fVar199 * fVar199 * auVar97._4_4_ * -0.5;
        auVar116._0_4_ = fVar190 * fVar190 * fVar190 * auVar97._0_4_ * -0.5;
        auVar116._8_4_ = fVar200 * fVar200 * fVar200 * auVar97._8_4_ * -0.5;
        auVar116._12_4_ = fVar201 * fVar201 * fVar201 * auVar97._12_4_ * -0.5;
        auVar116._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
        auVar116._20_4_ = fVar189 * fVar189 * fVar189 * -0.0;
        auVar116._24_4_ = fVar90 * fVar90 * fVar90 * -0.0;
        auVar116._28_4_ = 0;
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar100,auVar115);
        auVar117._4_4_ = auVar119._4_4_ * auVar116._4_4_;
        auVar117._0_4_ = auVar119._0_4_ * auVar116._0_4_;
        auVar117._8_4_ = auVar119._8_4_ * auVar116._8_4_;
        auVar117._12_4_ = auVar119._12_4_ * auVar116._12_4_;
        auVar117._16_4_ = auVar119._16_4_ * auVar116._16_4_;
        auVar117._20_4_ = auVar119._20_4_ * auVar116._20_4_;
        auVar117._24_4_ = auVar119._24_4_ * auVar116._24_4_;
        auVar117._28_4_ = auVar115._28_4_;
        auVar115._4_4_ = auVar116._4_4_ * -auVar118._4_4_;
        auVar115._0_4_ = auVar116._0_4_ * -auVar118._0_4_;
        auVar115._8_4_ = auVar116._8_4_ * -auVar118._8_4_;
        auVar115._12_4_ = auVar116._12_4_ * -auVar118._12_4_;
        auVar115._16_4_ = auVar116._16_4_ * -auVar118._16_4_;
        auVar115._20_4_ = auVar116._20_4_ * -auVar118._20_4_;
        auVar115._24_4_ = auVar116._24_4_ * -auVar118._24_4_;
        auVar115._28_4_ = auVar118._28_4_ ^ 0x80000000;
        auVar108 = vmulps_avx512vl(auVar116,ZEXT1632(auVar99));
        auVar118 = ZEXT1632(auVar99);
        auVar114 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar118);
        auVar97 = vfmadd231ps_fma(auVar114,auVar107,auVar107);
        auVar102 = vrsqrt14ps_avx512vl(ZEXT1632(auVar97));
        fVar190 = auVar102._0_4_;
        fVar199 = auVar102._4_4_;
        fVar200 = auVar102._8_4_;
        fVar201 = auVar102._12_4_;
        fVar173 = auVar102._16_4_;
        fVar189 = auVar102._20_4_;
        fVar90 = auVar102._24_4_;
        auVar114._4_4_ = fVar199 * fVar199 * fVar199 * auVar97._4_4_ * -0.5;
        auVar114._0_4_ = fVar190 * fVar190 * fVar190 * auVar97._0_4_ * -0.5;
        auVar114._8_4_ = fVar200 * fVar200 * fVar200 * auVar97._8_4_ * -0.5;
        auVar114._12_4_ = fVar201 * fVar201 * fVar201 * auVar97._12_4_ * -0.5;
        auVar114._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
        auVar114._20_4_ = fVar189 * fVar189 * fVar189 * -0.0;
        auVar114._24_4_ = fVar90 * fVar90 * fVar90 * -0.0;
        auVar114._28_4_ = 0;
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar100,auVar102);
        auVar101._4_4_ = auVar107._4_4_ * auVar114._4_4_;
        auVar101._0_4_ = auVar107._0_4_ * auVar114._0_4_;
        auVar101._8_4_ = auVar107._8_4_ * auVar114._8_4_;
        auVar101._12_4_ = auVar107._12_4_ * auVar114._12_4_;
        auVar101._16_4_ = auVar107._16_4_ * auVar114._16_4_;
        auVar101._20_4_ = auVar107._20_4_ * auVar114._20_4_;
        auVar101._24_4_ = auVar107._24_4_ * auVar114._24_4_;
        auVar101._28_4_ = auVar102._28_4_;
        auVar102._4_4_ = -auVar112._4_4_ * auVar114._4_4_;
        auVar102._0_4_ = -auVar112._0_4_ * auVar114._0_4_;
        auVar102._8_4_ = -auVar112._8_4_ * auVar114._8_4_;
        auVar102._12_4_ = -auVar112._12_4_ * auVar114._12_4_;
        auVar102._16_4_ = -auVar112._16_4_ * auVar114._16_4_;
        auVar102._20_4_ = -auVar112._20_4_ * auVar114._20_4_;
        auVar102._24_4_ = -auVar112._24_4_ * auVar114._24_4_;
        auVar102._28_4_ = auVar116._28_4_;
        auVar116 = vmulps_avx512vl(auVar114,auVar118);
        auVar97 = vfmadd213ps_fma(auVar117,auVar110,auVar103);
        auVar154 = vfmadd213ps_fma(auVar115,auVar110,auVar104);
        auVar114 = vfmadd213ps_avx512vl(auVar108,auVar110,auVar109);
        auVar100 = vfmadd213ps_avx512vl(auVar101,ZEXT1632(auVar153),auVar105);
        auVar98 = vfnmadd213ps_fma(auVar117,auVar110,auVar103);
        auVar103 = ZEXT1632(auVar153);
        auVar96 = vfmadd213ps_fma(auVar102,auVar103,auVar106);
        auVar92 = vfnmadd213ps_fma(auVar115,auVar110,auVar104);
        auVar22 = vfmadd213ps_fma(auVar116,auVar103,auVar113);
        auVar117 = vfnmadd231ps_avx512vl(auVar109,auVar110,auVar108);
        auVar150 = vfnmadd213ps_fma(auVar101,auVar103,auVar105);
        auVar151 = vfnmadd213ps_fma(auVar102,auVar103,auVar106);
        auVar152 = vfnmadd231ps_fma(auVar113,ZEXT1632(auVar153),auVar116);
        auVar115 = vsubps_avx512vl(auVar100,ZEXT1632(auVar98));
        auVar116 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar92));
        auVar101 = vsubps_avx512vl(ZEXT1632(auVar22),auVar117);
        auVar102 = vmulps_avx512vl(auVar116,auVar117);
        auVar23 = vfmsub231ps_fma(auVar102,ZEXT1632(auVar92),auVar101);
        auVar113._4_4_ = auVar98._4_4_ * auVar101._4_4_;
        auVar113._0_4_ = auVar98._0_4_ * auVar101._0_4_;
        auVar113._8_4_ = auVar98._8_4_ * auVar101._8_4_;
        auVar113._12_4_ = auVar98._12_4_ * auVar101._12_4_;
        auVar113._16_4_ = auVar101._16_4_ * 0.0;
        auVar113._20_4_ = auVar101._20_4_ * 0.0;
        auVar113._24_4_ = auVar101._24_4_ * 0.0;
        auVar113._28_4_ = auVar101._28_4_;
        auVar101 = vfmsub231ps_avx512vl(auVar113,auVar117,auVar115);
        auVar103._4_4_ = auVar92._4_4_ * auVar115._4_4_;
        auVar103._0_4_ = auVar92._0_4_ * auVar115._0_4_;
        auVar103._8_4_ = auVar92._8_4_ * auVar115._8_4_;
        auVar103._12_4_ = auVar92._12_4_ * auVar115._12_4_;
        auVar103._16_4_ = auVar115._16_4_ * 0.0;
        auVar103._20_4_ = auVar115._20_4_ * 0.0;
        auVar103._24_4_ = auVar115._24_4_ * 0.0;
        auVar103._28_4_ = auVar115._28_4_;
        auVar94 = vfmsub231ps_fma(auVar103,ZEXT1632(auVar98),auVar116);
        auVar116 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar118,auVar101);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar118,ZEXT1632(auVar23));
        auVar107 = ZEXT1632(auVar99);
        uVar80 = vcmpps_avx512vl(auVar116,auVar107,2);
        bVar79 = (byte)uVar80;
        fVar90 = (float)((uint)(bVar79 & 1) * auVar97._0_4_ |
                        (uint)!(bool)(bVar79 & 1) * auVar150._0_4_);
        bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
        fVar140 = (float)((uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar150._4_4_);
        bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
        fVar142 = (float)((uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar150._8_4_);
        bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
        fVar145 = (float)((uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar150._12_4_);
        auVar102 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar142,CONCAT44(fVar140,fVar90))));
        fVar91 = (float)((uint)(bVar79 & 1) * auVar154._0_4_ |
                        (uint)!(bool)(bVar79 & 1) * auVar151._0_4_);
        bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
        fVar141 = (float)((uint)bVar13 * auVar154._4_4_ | (uint)!bVar13 * auVar151._4_4_);
        bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
        fVar143 = (float)((uint)bVar13 * auVar154._8_4_ | (uint)!bVar13 * auVar151._8_4_);
        bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
        fVar146 = (float)((uint)bVar13 * auVar154._12_4_ | (uint)!bVar13 * auVar151._12_4_);
        auVar113 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar143,CONCAT44(fVar141,fVar91))));
        auVar108._0_4_ =
             (float)((uint)(bVar79 & 1) * auVar114._0_4_ |
                    (uint)!(bool)(bVar79 & 1) * auVar152._0_4_);
        bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * auVar152._4_4_);
        bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * auVar152._8_4_);
        bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * auVar152._12_4_);
        fVar190 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar114._16_4_);
        auVar108._16_4_ = fVar190;
        fVar199 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar114._20_4_);
        auVar108._20_4_ = fVar199;
        fVar200 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar114._24_4_);
        auVar108._24_4_ = fVar200;
        iVar1 = (uint)(byte)(uVar80 >> 7) * auVar114._28_4_;
        auVar108._28_4_ = iVar1;
        auVar115 = vblendmps_avx512vl(ZEXT1632(auVar98),auVar100);
        auVar120._0_4_ =
             (uint)(bVar79 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar23._0_4_;
        bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar23._4_4_;
        bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar23._8_4_;
        bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar23._12_4_;
        auVar120._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * auVar115._16_4_;
        auVar120._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * auVar115._20_4_;
        auVar120._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * auVar115._24_4_;
        auVar120._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar115._28_4_;
        auVar115 = vblendmps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar96));
        auVar121._0_4_ =
             (float)((uint)(bVar79 & 1) * auVar115._0_4_ |
                    (uint)!(bool)(bVar79 & 1) * auVar154._0_4_);
        bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar154._4_4_);
        bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar154._8_4_);
        bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar154._12_4_);
        fVar201 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar115._16_4_);
        auVar121._16_4_ = fVar201;
        fVar173 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar115._20_4_);
        auVar121._20_4_ = fVar173;
        fVar189 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar115._24_4_);
        auVar121._24_4_ = fVar189;
        auVar121._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar115._28_4_;
        auVar115 = vblendmps_avx512vl(auVar117,ZEXT1632(auVar22));
        auVar122._0_4_ =
             (float)((uint)(bVar79 & 1) * auVar115._0_4_ |
                    (uint)!(bool)(bVar79 & 1) * auVar114._0_4_);
        bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar114._4_4_);
        bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar114._8_4_);
        bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar114._12_4_);
        bVar13 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar122._16_4_ = (float)((uint)bVar13 * auVar115._16_4_ | (uint)!bVar13 * auVar114._16_4_);
        bVar13 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar122._20_4_ = (float)((uint)bVar13 * auVar115._20_4_ | (uint)!bVar13 * auVar114._20_4_);
        bVar13 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar122._24_4_ = (float)((uint)bVar13 * auVar115._24_4_ | (uint)!bVar13 * auVar114._24_4_);
        bVar13 = SUB81(uVar80 >> 7,0);
        auVar122._28_4_ = (uint)bVar13 * auVar115._28_4_ | (uint)!bVar13 * auVar114._28_4_;
        auVar123._0_4_ =
             (uint)(bVar79 & 1) * (int)auVar98._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar100._0_4_;
        bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar123._4_4_ = (uint)bVar13 * (int)auVar98._4_4_ | (uint)!bVar13 * auVar100._4_4_;
        bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar123._8_4_ = (uint)bVar13 * (int)auVar98._8_4_ | (uint)!bVar13 * auVar100._8_4_;
        bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar123._12_4_ = (uint)bVar13 * (int)auVar98._12_4_ | (uint)!bVar13 * auVar100._12_4_;
        auVar123._16_4_ = (uint)!(bool)((byte)(uVar80 >> 4) & 1) * auVar100._16_4_;
        auVar123._20_4_ = (uint)!(bool)((byte)(uVar80 >> 5) & 1) * auVar100._20_4_;
        auVar123._24_4_ = (uint)!(bool)((byte)(uVar80 >> 6) & 1) * auVar100._24_4_;
        auVar123._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar100._28_4_;
        bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar124._0_4_ =
             (uint)(bVar79 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar22._0_4_;
        bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * auVar22._4_4_;
        bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * auVar22._8_4_;
        bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * auVar22._12_4_;
        auVar124._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * auVar117._16_4_;
        auVar124._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * auVar117._20_4_;
        auVar124._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * auVar117._24_4_;
        iVar2 = (uint)(byte)(uVar80 >> 7) * auVar117._28_4_;
        auVar124._28_4_ = iVar2;
        auVar103 = vsubps_avx512vl(auVar123,auVar102);
        auVar117 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar92._12_4_ |
                                                 (uint)!bVar16 * auVar96._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar92._8_4_ |
                                                          (uint)!bVar15 * auVar96._8_4_,
                                                          CONCAT44((uint)bVar13 * (int)auVar92._4_4_
                                                                   | (uint)!bVar13 * auVar96._4_4_,
                                                                   (uint)(bVar79 & 1) *
                                                                   (int)auVar92._0_4_ |
                                                                   (uint)!(bool)(bVar79 & 1) *
                                                                   auVar96._0_4_)))),auVar113);
        auVar115 = vsubps_avx(auVar124,auVar108);
        auVar114 = vsubps_avx(auVar102,auVar120);
        auVar100 = vsubps_avx(auVar113,auVar121);
        auVar101 = vsubps_avx(auVar108,auVar122);
        auVar104._4_4_ = auVar115._4_4_ * fVar140;
        auVar104._0_4_ = auVar115._0_4_ * fVar90;
        auVar104._8_4_ = auVar115._8_4_ * fVar142;
        auVar104._12_4_ = auVar115._12_4_ * fVar145;
        auVar104._16_4_ = auVar115._16_4_ * 0.0;
        auVar104._20_4_ = auVar115._20_4_ * 0.0;
        auVar104._24_4_ = auVar115._24_4_ * 0.0;
        auVar104._28_4_ = iVar2;
        auVar97 = vfmsub231ps_fma(auVar104,auVar108,auVar103);
        auVar105._4_4_ = fVar141 * auVar103._4_4_;
        auVar105._0_4_ = fVar91 * auVar103._0_4_;
        auVar105._8_4_ = fVar143 * auVar103._8_4_;
        auVar105._12_4_ = fVar146 * auVar103._12_4_;
        auVar105._16_4_ = auVar103._16_4_ * 0.0;
        auVar105._20_4_ = auVar103._20_4_ * 0.0;
        auVar105._24_4_ = auVar103._24_4_ * 0.0;
        auVar105._28_4_ = auVar116._28_4_;
        auVar154 = vfmsub231ps_fma(auVar105,auVar102,auVar117);
        auVar116 = vfmadd231ps_avx512vl(ZEXT1632(auVar154),auVar107,ZEXT1632(auVar97));
        auVar193._0_4_ = auVar117._0_4_ * auVar108._0_4_;
        auVar193._4_4_ = auVar117._4_4_ * auVar108._4_4_;
        auVar193._8_4_ = auVar117._8_4_ * auVar108._8_4_;
        auVar193._12_4_ = auVar117._12_4_ * auVar108._12_4_;
        auVar193._16_4_ = auVar117._16_4_ * fVar190;
        auVar193._20_4_ = auVar117._20_4_ * fVar199;
        auVar193._24_4_ = auVar117._24_4_ * fVar200;
        auVar193._28_4_ = 0;
        auVar97 = vfmsub231ps_fma(auVar193,auVar113,auVar115);
        auVar104 = vfmadd231ps_avx512vl(auVar116,auVar107,ZEXT1632(auVar97));
        auVar116 = vmulps_avx512vl(auVar101,auVar120);
        auVar116 = vfmsub231ps_avx512vl(auVar116,auVar114,auVar122);
        auVar106._4_4_ = auVar100._4_4_ * auVar122._4_4_;
        auVar106._0_4_ = auVar100._0_4_ * auVar122._0_4_;
        auVar106._8_4_ = auVar100._8_4_ * auVar122._8_4_;
        auVar106._12_4_ = auVar100._12_4_ * auVar122._12_4_;
        auVar106._16_4_ = auVar100._16_4_ * auVar122._16_4_;
        auVar106._20_4_ = auVar100._20_4_ * auVar122._20_4_;
        auVar106._24_4_ = auVar100._24_4_ * auVar122._24_4_;
        auVar106._28_4_ = auVar122._28_4_;
        auVar97 = vfmsub231ps_fma(auVar106,auVar121,auVar101);
        auVar194._0_4_ = auVar121._0_4_ * auVar114._0_4_;
        auVar194._4_4_ = auVar121._4_4_ * auVar114._4_4_;
        auVar194._8_4_ = auVar121._8_4_ * auVar114._8_4_;
        auVar194._12_4_ = auVar121._12_4_ * auVar114._12_4_;
        auVar194._16_4_ = fVar201 * auVar114._16_4_;
        auVar194._20_4_ = fVar173 * auVar114._20_4_;
        auVar194._24_4_ = fVar189 * auVar114._24_4_;
        auVar194._28_4_ = 0;
        auVar154 = vfmsub231ps_fma(auVar194,auVar100,auVar120);
        auVar116 = vfmadd231ps_avx512vl(ZEXT1632(auVar154),auVar107,auVar116);
        auVar105 = vfmadd231ps_avx512vl(auVar116,auVar107,ZEXT1632(auVar97));
        auVar116 = vmaxps_avx(auVar104,auVar105);
        uVar164 = vcmpps_avx512vl(auVar116,auVar107,2);
        bVar89 = bVar89 & (byte)uVar164;
        in_ZMM20 = ZEXT3264(local_600);
        in_ZMM21 = ZEXT3264(local_620);
        auVar230 = ZEXT3264(local_560);
        auVar228 = ZEXT3264(local_6a0);
        if (bVar89 == 0) {
          bVar89 = 0;
          auVar214 = ZEXT3264(auVar186);
          auVar188 = ZEXT3264(auVar125);
        }
        else {
          auVar37._4_4_ = auVar101._4_4_ * auVar117._4_4_;
          auVar37._0_4_ = auVar101._0_4_ * auVar117._0_4_;
          auVar37._8_4_ = auVar101._8_4_ * auVar117._8_4_;
          auVar37._12_4_ = auVar101._12_4_ * auVar117._12_4_;
          auVar37._16_4_ = auVar101._16_4_ * auVar117._16_4_;
          auVar37._20_4_ = auVar101._20_4_ * auVar117._20_4_;
          auVar37._24_4_ = auVar101._24_4_ * auVar117._24_4_;
          auVar37._28_4_ = auVar116._28_4_;
          auVar96 = vfmsub231ps_fma(auVar37,auVar100,auVar115);
          auVar38._4_4_ = auVar115._4_4_ * auVar114._4_4_;
          auVar38._0_4_ = auVar115._0_4_ * auVar114._0_4_;
          auVar38._8_4_ = auVar115._8_4_ * auVar114._8_4_;
          auVar38._12_4_ = auVar115._12_4_ * auVar114._12_4_;
          auVar38._16_4_ = auVar115._16_4_ * auVar114._16_4_;
          auVar38._20_4_ = auVar115._20_4_ * auVar114._20_4_;
          auVar38._24_4_ = auVar115._24_4_ * auVar114._24_4_;
          auVar38._28_4_ = auVar115._28_4_;
          auVar154 = vfmsub231ps_fma(auVar38,auVar103,auVar101);
          auVar39._4_4_ = auVar100._4_4_ * auVar103._4_4_;
          auVar39._0_4_ = auVar100._0_4_ * auVar103._0_4_;
          auVar39._8_4_ = auVar100._8_4_ * auVar103._8_4_;
          auVar39._12_4_ = auVar100._12_4_ * auVar103._12_4_;
          auVar39._16_4_ = auVar100._16_4_ * auVar103._16_4_;
          auVar39._20_4_ = auVar100._20_4_ * auVar103._20_4_;
          auVar39._24_4_ = auVar100._24_4_ * auVar103._24_4_;
          auVar39._28_4_ = auVar100._28_4_;
          auVar22 = vfmsub231ps_fma(auVar39,auVar114,auVar117);
          auVar97 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar154),ZEXT1632(auVar22));
          auVar116 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar96),auVar107);
          auVar117 = vrcp14ps_avx512vl(auVar116);
          auVar28._8_4_ = 0x3f800000;
          auVar28._0_8_ = &DAT_3f8000003f800000;
          auVar28._12_4_ = 0x3f800000;
          auVar28._16_4_ = 0x3f800000;
          auVar28._20_4_ = 0x3f800000;
          auVar28._24_4_ = 0x3f800000;
          auVar28._28_4_ = 0x3f800000;
          auVar115 = vfnmadd213ps_avx512vl(auVar117,auVar116,auVar28);
          auVar97 = vfmadd132ps_fma(auVar115,auVar117,auVar117);
          auVar40._4_4_ = auVar22._4_4_ * auVar108._4_4_;
          auVar40._0_4_ = auVar22._0_4_ * auVar108._0_4_;
          auVar40._8_4_ = auVar22._8_4_ * auVar108._8_4_;
          auVar40._12_4_ = auVar22._12_4_ * auVar108._12_4_;
          auVar40._16_4_ = fVar190 * 0.0;
          auVar40._20_4_ = fVar199 * 0.0;
          auVar40._24_4_ = fVar200 * 0.0;
          auVar40._28_4_ = iVar1;
          auVar154 = vfmadd231ps_fma(auVar40,auVar113,ZEXT1632(auVar154));
          auVar154 = vfmadd231ps_fma(ZEXT1632(auVar154),auVar102,ZEXT1632(auVar96));
          fVar190 = auVar97._0_4_;
          fVar199 = auVar97._4_4_;
          fVar200 = auVar97._8_4_;
          fVar201 = auVar97._12_4_;
          auVar117 = ZEXT1632(CONCAT412(auVar154._12_4_ * fVar201,
                                        CONCAT48(auVar154._8_4_ * fVar200,
                                                 CONCAT44(auVar154._4_4_ * fVar199,
                                                          auVar154._0_4_ * fVar190))));
          auVar217._4_4_ = uVar84;
          auVar217._0_4_ = uVar84;
          auVar217._8_4_ = uVar84;
          auVar217._12_4_ = uVar84;
          auVar217._16_4_ = uVar84;
          auVar217._20_4_ = uVar84;
          auVar217._24_4_ = uVar84;
          auVar217._28_4_ = uVar84;
          uVar164 = vcmpps_avx512vl(auVar217,auVar117,2);
          uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar29._4_4_ = uVar149;
          auVar29._0_4_ = uVar149;
          auVar29._8_4_ = uVar149;
          auVar29._12_4_ = uVar149;
          auVar29._16_4_ = uVar149;
          auVar29._20_4_ = uVar149;
          auVar29._24_4_ = uVar149;
          auVar29._28_4_ = uVar149;
          uVar25 = vcmpps_avx512vl(auVar117,auVar29,2);
          bVar89 = (byte)uVar164 & (byte)uVar25 & bVar89;
          if (bVar89 == 0) {
            bVar89 = 0;
            auVar214 = ZEXT3264(auVar186);
            auVar188 = ZEXT3264(auVar125);
          }
          else {
            uVar164 = vcmpps_avx512vl(auVar116,auVar107,4);
            if ((bVar89 & (byte)uVar164) == 0) {
              bVar89 = 0;
              auVar214 = ZEXT3264(auVar186);
              auVar188 = ZEXT3264(auVar125);
            }
            else {
              bVar89 = bVar89 & (byte)uVar164;
              fVar173 = auVar104._0_4_ * fVar190;
              fVar189 = auVar104._4_4_ * fVar199;
              auVar125._4_4_ = fVar189;
              auVar125._0_4_ = fVar173;
              fVar90 = auVar104._8_4_ * fVar200;
              auVar125._8_4_ = fVar90;
              fVar91 = auVar104._12_4_ * fVar201;
              auVar125._12_4_ = fVar91;
              fVar140 = auVar104._16_4_ * 0.0;
              auVar125._16_4_ = fVar140;
              fVar141 = auVar104._20_4_ * 0.0;
              auVar125._20_4_ = fVar141;
              fVar142 = auVar104._24_4_ * 0.0;
              auVar125._24_4_ = fVar142;
              auVar125._28_4_ = auVar104._28_4_;
              fVar190 = auVar105._0_4_ * fVar190;
              fVar199 = auVar105._4_4_ * fVar199;
              auVar186._4_4_ = fVar199;
              auVar186._0_4_ = fVar190;
              fVar200 = auVar105._8_4_ * fVar200;
              auVar186._8_4_ = fVar200;
              fVar201 = auVar105._12_4_ * fVar201;
              auVar186._12_4_ = fVar201;
              fVar143 = auVar105._16_4_ * 0.0;
              auVar186._16_4_ = fVar143;
              fVar145 = auVar105._20_4_ * 0.0;
              auVar186._20_4_ = fVar145;
              fVar146 = auVar105._24_4_ * 0.0;
              auVar186._24_4_ = fVar146;
              auVar186._28_4_ = auVar105._28_4_;
              auVar207._8_4_ = 0x3f800000;
              auVar207._0_8_ = &DAT_3f8000003f800000;
              auVar207._12_4_ = 0x3f800000;
              auVar207._16_4_ = 0x3f800000;
              auVar207._20_4_ = 0x3f800000;
              auVar207._24_4_ = 0x3f800000;
              auVar207._28_4_ = 0x3f800000;
              auVar125 = vsubps_avx(auVar207,auVar125);
              bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar80 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar80 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar80 >> 6) & 1);
              bVar19 = SUB81(uVar80 >> 7,0);
              auVar214 = ZEXT3264(CONCAT428((uint)bVar19 * auVar104._28_4_ |
                                            (uint)!bVar19 * auVar125._28_4_,
                                            CONCAT424((uint)bVar18 * (int)fVar142 |
                                                      (uint)!bVar18 * auVar125._24_4_,
                                                      CONCAT420((uint)bVar17 * (int)fVar141 |
                                                                (uint)!bVar17 * auVar125._20_4_,
                                                                CONCAT416((uint)bVar16 *
                                                                          (int)fVar140 |
                                                                          (uint)!bVar16 *
                                                                          auVar125._16_4_,
                                                                          CONCAT412((uint)bVar15 *
                                                                                    (int)fVar91 |
                                                                                    (uint)!bVar15 *
                                                                                    auVar125._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar14 * (int)fVar90 |
                                                  (uint)!bVar14 * auVar125._8_4_,
                                                  CONCAT44((uint)bVar13 * (int)fVar189 |
                                                           (uint)!bVar13 * auVar125._4_4_,
                                                           (uint)(bVar79 & 1) * (int)fVar173 |
                                                           (uint)!(bool)(bVar79 & 1) *
                                                           auVar125._0_4_))))))));
              auVar125 = vsubps_avx(auVar207,auVar186);
              bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar80 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar80 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar80 >> 6) & 1);
              bVar19 = SUB81(uVar80 >> 7,0);
              local_340._4_4_ = (uint)bVar13 * (int)fVar199 | (uint)!bVar13 * auVar125._4_4_;
              local_340._0_4_ =
                   (uint)(bVar79 & 1) * (int)fVar190 | (uint)!(bool)(bVar79 & 1) * auVar125._0_4_;
              local_340._8_4_ = (uint)bVar14 * (int)fVar200 | (uint)!bVar14 * auVar125._8_4_;
              local_340._12_4_ = (uint)bVar15 * (int)fVar201 | (uint)!bVar15 * auVar125._12_4_;
              local_340._16_4_ = (uint)bVar16 * (int)fVar143 | (uint)!bVar16 * auVar125._16_4_;
              local_340._20_4_ = (uint)bVar17 * (int)fVar145 | (uint)!bVar17 * auVar125._20_4_;
              local_340._24_4_ = (uint)bVar18 * (int)fVar146 | (uint)!bVar18 * auVar125._24_4_;
              local_340._28_4_ = (uint)bVar19 * auVar105._28_4_ | (uint)!bVar19 * auVar125._28_4_;
              auVar188 = ZEXT3264(auVar117);
            }
          }
        }
        auVar233 = ZEXT3264(local_660);
        auVar232 = ZEXT3264(local_640);
        if (bVar89 != 0) {
          auVar125 = vsubps_avx(ZEXT1632(auVar153),auVar110);
          auVar116 = auVar214._0_32_;
          auVar97 = vfmadd213ps_fma(auVar125,auVar116,auVar110);
          uVar149 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar110._4_4_ = uVar149;
          auVar110._0_4_ = uVar149;
          auVar110._8_4_ = uVar149;
          auVar110._12_4_ = uVar149;
          auVar110._16_4_ = uVar149;
          auVar110._20_4_ = uVar149;
          auVar110._24_4_ = uVar149;
          auVar110._28_4_ = uVar149;
          auVar125 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar97._12_4_ + auVar97._12_4_,
                                                        CONCAT48(auVar97._8_4_ + auVar97._8_4_,
                                                                 CONCAT44(auVar97._4_4_ +
                                                                          auVar97._4_4_,
                                                                          auVar97._0_4_ +
                                                                          auVar97._0_4_)))),auVar110
                                    );
          auVar186 = auVar188._0_32_;
          uVar164 = vcmpps_avx512vl(auVar186,auVar125,6);
          bVar89 = bVar89 & (byte)uVar164;
          if (bVar89 != 0) {
            auVar157._8_4_ = 0xbf800000;
            auVar157._0_8_ = 0xbf800000bf800000;
            auVar157._12_4_ = 0xbf800000;
            auVar157._16_4_ = 0xbf800000;
            auVar157._20_4_ = 0xbf800000;
            auVar157._24_4_ = 0xbf800000;
            auVar157._28_4_ = 0xbf800000;
            auVar30._8_4_ = 0x40000000;
            auVar30._0_8_ = 0x4000000040000000;
            auVar30._12_4_ = 0x40000000;
            auVar30._16_4_ = 0x40000000;
            auVar30._20_4_ = 0x40000000;
            auVar30._24_4_ = 0x40000000;
            auVar30._28_4_ = 0x40000000;
            local_4a0 = vfmadd132ps_avx512vl(local_340,auVar157,auVar30);
            local_340 = local_4a0;
            auVar125 = local_340;
            local_460 = 0;
            local_340 = auVar125;
            if ((pGVar85->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              fVar190 = 1.0 / auVar111._0_4_;
              local_400[0] = fVar190 * (auVar214._0_4_ + 0.0);
              local_400[1] = fVar190 * (auVar214._4_4_ + 1.0);
              local_400[2] = fVar190 * (auVar214._8_4_ + 2.0);
              local_400[3] = fVar190 * (auVar214._12_4_ + 3.0);
              fStack_3f0 = fVar190 * (auVar214._16_4_ + 4.0);
              fStack_3ec = fVar190 * (auVar214._20_4_ + 5.0);
              fStack_3e8 = fVar190 * (auVar214._24_4_ + 6.0);
              fStack_3e4 = auVar214._28_4_ + 7.0;
              local_340._0_8_ = local_4a0._0_8_;
              local_340._8_8_ = local_4a0._8_8_;
              local_340._16_8_ = local_4a0._16_8_;
              local_340._24_8_ = local_4a0._24_8_;
              local_3e0 = local_340._0_8_;
              uStack_3d8 = local_340._8_8_;
              uStack_3d0 = local_340._16_8_;
              uStack_3c8 = local_340._24_8_;
              local_3c0 = auVar186;
              auVar158._8_4_ = 0x7f800000;
              auVar158._0_8_ = 0x7f8000007f800000;
              auVar158._12_4_ = 0x7f800000;
              auVar158._16_4_ = 0x7f800000;
              auVar158._20_4_ = 0x7f800000;
              auVar158._24_4_ = 0x7f800000;
              auVar158._28_4_ = 0x7f800000;
              auVar125 = vblendmps_avx512vl(auVar158,auVar186);
              auVar126._0_4_ =
                   (uint)(bVar89 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar89 & 1) * 0x7f800000;
              bVar13 = (bool)(bVar89 >> 1 & 1);
              auVar126._4_4_ = (uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar89 >> 2 & 1);
              auVar126._8_4_ = (uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar89 >> 3 & 1);
              auVar126._12_4_ = (uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar89 >> 4 & 1);
              auVar126._16_4_ = (uint)bVar13 * auVar125._16_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar89 >> 5 & 1);
              auVar126._20_4_ = (uint)bVar13 * auVar125._20_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar89 >> 6 & 1);
              auVar126._24_4_ = (uint)bVar13 * auVar125._24_4_ | (uint)!bVar13 * 0x7f800000;
              auVar126._28_4_ =
                   (uint)(bVar89 >> 7) * auVar125._28_4_ | (uint)!(bool)(bVar89 >> 7) * 0x7f800000;
              auVar125 = vshufps_avx(auVar126,auVar126,0xb1);
              auVar125 = vminps_avx(auVar126,auVar125);
              auVar117 = vshufpd_avx(auVar125,auVar125,5);
              auVar125 = vminps_avx(auVar125,auVar117);
              auVar117 = vpermpd_avx2(auVar125,0x4e);
              auVar125 = vminps_avx(auVar125,auVar117);
              uVar164 = vcmpps_avx512vl(auVar126,auVar125,0);
              bVar78 = (byte)uVar164 & bVar89;
              bVar79 = bVar89;
              if (bVar78 != 0) {
                bVar79 = bVar78;
              }
              uVar82 = 0;
              for (uVar81 = (uint)bVar79; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
                uVar82 = uVar82 + 1;
              }
              uVar80 = (ulong)uVar82;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar85->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar190 = local_400[uVar80];
                uVar149 = *(undefined4 *)((long)&local_3e0 + uVar80 * 4);
                fVar199 = 1.0 - fVar190;
                auVar96 = vfnmadd231ss_fma(ZEXT416((uint)(fVar190 * (fVar199 + fVar199))),
                                           ZEXT416((uint)fVar199),ZEXT416((uint)fVar199));
                auVar153 = ZEXT416((uint)fVar190);
                auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar153,
                                          ZEXT416(0xc0a00000));
                auVar154 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190 * 3.0)),
                                           ZEXT416((uint)(fVar190 + fVar190)),auVar97);
                auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar153,
                                          ZEXT416(0x40000000));
                auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar199 * fVar199 * -3.0)),
                                          ZEXT416((uint)(fVar199 + fVar199)),auVar97);
                auVar153 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190)),auVar153,
                                           ZEXT416((uint)(fVar199 * -2.0)));
                fVar199 = auVar96._0_4_ * 0.5;
                fVar200 = auVar154._0_4_ * 0.5;
                fVar201 = auVar97._0_4_ * 0.5;
                auVar214 = ZEXT3264(auVar116);
                fVar173 = auVar153._0_4_ * 0.5;
                auVar178._0_4_ = fVar173 * local_6c0;
                auVar178._4_4_ = fVar173 * fStack_6bc;
                auVar178._8_4_ = fVar173 * fStack_6b8;
                auVar178._12_4_ = fVar173 * fStack_6b4;
                auVar203._4_4_ = fVar201;
                auVar203._0_4_ = fVar201;
                auVar203._8_4_ = fVar201;
                auVar203._12_4_ = fVar201;
                auVar97 = vfmadd132ps_fma(auVar203,auVar178,*pauVar4);
                auVar179._4_4_ = fVar200;
                auVar179._0_4_ = fVar200;
                auVar179._8_4_ = fVar200;
                auVar179._12_4_ = fVar200;
                auVar97 = vfmadd132ps_fma(auVar179,auVar97,*pauVar3);
                auVar171._4_4_ = fVar199;
                auVar171._0_4_ = fVar199;
                auVar171._8_4_ = fVar199;
                auVar171._12_4_ = fVar199;
                auVar97 = vfmadd213ps_fma(auVar171,auVar95,auVar97);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar80 * 4);
                auVar188 = ZEXT3264(auVar186);
                *(int *)(ray + k * 4 + 0x180) = auVar97._0_4_;
                uVar11 = vextractps_avx(auVar97,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar11;
                uVar11 = vextractps_avx(auVar97,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar11;
                *(float *)(ray + k * 4 + 0x1e0) = fVar190;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar149;
                *(uint *)(ray + k * 4 + 0x220) = uVar9;
                *(uint *)(ray + k * 4 + 0x240) = uVar86;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_3a0 = vpbroadcastd_avx512vl();
                local_520 = vpbroadcastd_avx512vl();
                local_5a0 = (undefined4)uVar24;
                uStack_59c = (undefined4)((ulong)uVar24 >> 0x20);
                local_5c0 = local_6c0;
                fStack_5bc = fStack_6bc;
                fStack_5b8 = fStack_6b8;
                fStack_5b4 = fStack_6b4;
                local_5b0 = uVar66;
                uStack_5a8 = uVar67;
                uStack_598 = uVar65;
                local_4c0 = auVar116;
                local_480 = auVar186;
                local_45c = iVar10;
                local_450 = auVar95;
                local_440 = uVar24;
                uStack_438 = uVar65;
                local_430 = uVar66;
                uStack_428 = uVar67;
                local_410 = bVar89;
                do {
                  auVar96 = auVar231._0_16_;
                  local_380._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar190 = local_400[uVar80];
                  auVar167._4_4_ = fVar190;
                  auVar167._0_4_ = fVar190;
                  auVar167._8_4_ = fVar190;
                  auVar167._12_4_ = fVar190;
                  local_260._16_4_ = fVar190;
                  local_260._0_16_ = auVar167;
                  local_260._20_4_ = fVar190;
                  local_260._24_4_ = fVar190;
                  local_260._28_4_ = fVar190;
                  local_240 = *(undefined4 *)((long)&local_3e0 + uVar80 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar80 * 4);
                  local_6f0.context = context->user;
                  fVar199 = 1.0 - fVar190;
                  auVar153 = vfnmadd231ss_fma(ZEXT416((uint)(fVar190 * (fVar199 + fVar199))),
                                              ZEXT416((uint)fVar199),ZEXT416((uint)fVar199));
                  auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar167,
                                            ZEXT416(0xc0a00000));
                  auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190 * 3.0)),
                                            ZEXT416((uint)(fVar190 + fVar190)),auVar93);
                  auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar167,
                                            ZEXT416(0x40000000));
                  auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar199 * fVar199 * -3.0)),
                                            ZEXT416((uint)(fVar199 + fVar199)),auVar93);
                  auVar154 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190)),auVar167,
                                             ZEXT416((uint)(fVar199 * -2.0)));
                  fVar190 = auVar153._0_4_ * 0.5;
                  fVar199 = auVar97._0_4_ * 0.5;
                  fVar200 = auVar93._0_4_ * 0.5;
                  fVar201 = auVar154._0_4_ * 0.5;
                  auVar184._0_4_ = fVar201 * local_5c0;
                  auVar184._4_4_ = fVar201 * fStack_5bc;
                  auVar184._8_4_ = fVar201 * fStack_5b8;
                  auVar184._12_4_ = fVar201 * fStack_5b4;
                  auVar206._4_4_ = fVar200;
                  auVar206._0_4_ = fVar200;
                  auVar206._8_4_ = fVar200;
                  auVar206._12_4_ = fVar200;
                  auVar75._8_8_ = uStack_5a8;
                  auVar75._0_8_ = local_5b0;
                  auVar93 = vfmadd132ps_fma(auVar206,auVar184,auVar75);
                  auVar185._4_4_ = fVar199;
                  auVar185._0_4_ = fVar199;
                  auVar185._8_4_ = fVar199;
                  auVar185._12_4_ = fVar199;
                  auVar76._4_4_ = uStack_59c;
                  auVar76._0_4_ = local_5a0;
                  auVar76._8_8_ = uStack_598;
                  auVar93 = vfmadd132ps_fma(auVar185,auVar93,auVar76);
                  auVar156._4_4_ = fVar190;
                  auVar156._0_4_ = fVar190;
                  auVar156._8_4_ = fVar190;
                  auVar156._12_4_ = fVar190;
                  auVar93 = vfmadd213ps_fma(auVar156,auVar95,auVar93);
                  local_2c0 = auVar93._0_4_;
                  auVar198._8_4_ = 1;
                  auVar198._0_8_ = 0x100000001;
                  auVar198._12_4_ = 1;
                  auVar198._16_4_ = 1;
                  auVar198._20_4_ = 1;
                  auVar198._24_4_ = 1;
                  auVar198._28_4_ = 1;
                  local_2a0 = vpermps_avx2(auVar198,ZEXT1632(auVar93));
                  auVar210._8_4_ = 2;
                  auVar210._0_8_ = 0x200000002;
                  auVar210._12_4_ = 2;
                  auVar210._16_4_ = 2;
                  auVar210._20_4_ = 2;
                  auVar210._24_4_ = 2;
                  auVar210._28_4_ = 2;
                  local_280 = vpermps_avx2(auVar210,ZEXT1632(auVar93));
                  iStack_2bc = local_2c0;
                  iStack_2b8 = local_2c0;
                  iStack_2b4 = local_2c0;
                  iStack_2b0 = local_2c0;
                  iStack_2ac = local_2c0;
                  iStack_2a8 = local_2c0;
                  iStack_2a4 = local_2c0;
                  uStack_23c = local_240;
                  uStack_238 = local_240;
                  uStack_234 = local_240;
                  uStack_230 = local_240;
                  uStack_22c = local_240;
                  uStack_228 = local_240;
                  uStack_224 = local_240;
                  local_220 = local_520._0_8_;
                  uStack_218 = local_520._8_8_;
                  uStack_210 = local_520._16_8_;
                  uStack_208 = local_520._24_8_;
                  local_200 = local_3a0;
                  auVar125 = vpcmpeqd_avx2(local_3a0,local_3a0);
                  local_6a8[1] = auVar125;
                  *local_6a8 = auVar125;
                  local_1e0 = (local_6f0.context)->instID[0];
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = (local_6f0.context)->instPrimID[0];
                  uStack_1bc = local_1c0;
                  uStack_1b8 = local_1c0;
                  uStack_1b4 = local_1c0;
                  uStack_1b0 = local_1c0;
                  uStack_1ac = local_1c0;
                  uStack_1a8 = local_1c0;
                  uStack_1a4 = local_1c0;
                  local_5e0 = local_300._0_8_;
                  uStack_5d8 = local_300._8_8_;
                  uStack_5d0 = local_300._16_8_;
                  uStack_5c8 = local_300._24_8_;
                  local_6f0.valid = (int *)&local_5e0;
                  local_6f0.geometryUserPtr = pGVar85->userPtr;
                  local_6f0.hit = (RTCHitN *)&local_2c0;
                  local_6f0.N = 8;
                  local_500 = (uint)uVar80;
                  uStack_4fc = (uint)(uVar80 >> 0x20);
                  local_6f0.ray = (RTCRayN *)ray;
                  if (pGVar85->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar85->intersectionFilterN)(&local_6f0);
                    uVar80 = CONCAT44(uStack_4fc,local_500);
                    auVar234 = ZEXT1664(local_540._0_16_);
                    auVar233 = ZEXT3264(local_660);
                    auVar232 = ZEXT3264(local_640);
                    auVar228 = ZEXT3264(local_6a0);
                    auVar229 = ZEXT3264(local_680);
                    auVar230 = ZEXT3264(local_560);
                    in_ZMM21 = ZEXT3264(local_620);
                    in_ZMM20 = ZEXT3264(local_600);
                    auVar93 = vxorps_avx512vl(auVar96,auVar96);
                    auVar231 = ZEXT1664(auVar93);
                    uVar84 = local_580._0_4_;
                  }
                  auVar93 = auVar231._0_16_;
                  auVar71._8_8_ = uStack_5d8;
                  auVar71._0_8_ = local_5e0;
                  auVar71._16_8_ = uStack_5d0;
                  auVar71._24_8_ = uStack_5c8;
                  if (auVar71 == (undefined1  [32])0x0) {
LAB_01b682c7:
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_380._0_4_;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar85->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_6f0);
                      uVar80 = CONCAT44(uStack_4fc,local_500);
                      auVar234 = ZEXT1664(local_540._0_16_);
                      auVar233 = ZEXT3264(local_660);
                      auVar232 = ZEXT3264(local_640);
                      auVar228 = ZEXT3264(local_6a0);
                      auVar229 = ZEXT3264(local_680);
                      auVar230 = ZEXT3264(local_560);
                      in_ZMM21 = ZEXT3264(local_620);
                      in_ZMM20 = ZEXT3264(local_600);
                      auVar93 = vxorps_avx512vl(auVar93,auVar93);
                      auVar231 = ZEXT1664(auVar93);
                      uVar84 = local_580._0_4_;
                    }
                    auVar72._8_8_ = uStack_5d8;
                    auVar72._0_8_ = local_5e0;
                    auVar72._16_8_ = uStack_5d0;
                    auVar72._24_8_ = uStack_5c8;
                    if (auVar72 == (undefined1  [32])0x0) goto LAB_01b682c7;
                    uVar83 = vptestmd_avx512vl(auVar72,auVar72);
                    iVar1 = *(int *)(local_6f0.hit + 4);
                    iVar2 = *(int *)(local_6f0.hit + 8);
                    iVar60 = *(int *)(local_6f0.hit + 0xc);
                    iVar61 = *(int *)(local_6f0.hit + 0x10);
                    iVar62 = *(int *)(local_6f0.hit + 0x14);
                    iVar63 = *(int *)(local_6f0.hit + 0x18);
                    iVar64 = *(int *)(local_6f0.hit + 0x1c);
                    bVar79 = (byte)uVar83;
                    bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
                    bVar19 = SUB81(uVar83 >> 7,0);
                    *(uint *)(local_6f0.ray + 0x180) =
                         (uint)(bVar79 & 1) * *(int *)local_6f0.hit |
                         (uint)!(bool)(bVar79 & 1) * *(int *)(local_6f0.ray + 0x180);
                    *(uint *)(local_6f0.ray + 0x184) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_6f0.ray + 0x184);
                    *(uint *)(local_6f0.ray + 0x188) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_6f0.ray + 0x188);
                    *(uint *)(local_6f0.ray + 0x18c) =
                         (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_6f0.ray + 0x18c);
                    *(uint *)(local_6f0.ray + 400) =
                         (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_6f0.ray + 400);
                    *(uint *)(local_6f0.ray + 0x194) =
                         (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_6f0.ray + 0x194);
                    *(uint *)(local_6f0.ray + 0x198) =
                         (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_6f0.ray + 0x198);
                    *(uint *)(local_6f0.ray + 0x19c) =
                         (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_6f0.ray + 0x19c);
                    iVar1 = *(int *)(local_6f0.hit + 0x24);
                    iVar2 = *(int *)(local_6f0.hit + 0x28);
                    iVar60 = *(int *)(local_6f0.hit + 0x2c);
                    iVar61 = *(int *)(local_6f0.hit + 0x30);
                    iVar62 = *(int *)(local_6f0.hit + 0x34);
                    iVar63 = *(int *)(local_6f0.hit + 0x38);
                    iVar64 = *(int *)(local_6f0.hit + 0x3c);
                    bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
                    bVar19 = SUB81(uVar83 >> 7,0);
                    *(uint *)(local_6f0.ray + 0x1a0) =
                         (uint)(bVar79 & 1) * *(int *)(local_6f0.hit + 0x20) |
                         (uint)!(bool)(bVar79 & 1) * *(int *)(local_6f0.ray + 0x1a0);
                    *(uint *)(local_6f0.ray + 0x1a4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_6f0.ray + 0x1a4);
                    *(uint *)(local_6f0.ray + 0x1a8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_6f0.ray + 0x1a8);
                    *(uint *)(local_6f0.ray + 0x1ac) =
                         (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_6f0.ray + 0x1ac);
                    *(uint *)(local_6f0.ray + 0x1b0) =
                         (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_6f0.ray + 0x1b0);
                    *(uint *)(local_6f0.ray + 0x1b4) =
                         (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_6f0.ray + 0x1b4);
                    *(uint *)(local_6f0.ray + 0x1b8) =
                         (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_6f0.ray + 0x1b8);
                    *(uint *)(local_6f0.ray + 0x1bc) =
                         (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_6f0.ray + 0x1bc);
                    iVar1 = *(int *)(local_6f0.hit + 0x44);
                    iVar2 = *(int *)(local_6f0.hit + 0x48);
                    iVar60 = *(int *)(local_6f0.hit + 0x4c);
                    iVar61 = *(int *)(local_6f0.hit + 0x50);
                    iVar62 = *(int *)(local_6f0.hit + 0x54);
                    iVar63 = *(int *)(local_6f0.hit + 0x58);
                    iVar64 = *(int *)(local_6f0.hit + 0x5c);
                    bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
                    bVar19 = SUB81(uVar83 >> 7,0);
                    *(uint *)(local_6f0.ray + 0x1c0) =
                         (uint)(bVar79 & 1) * *(int *)(local_6f0.hit + 0x40) |
                         (uint)!(bool)(bVar79 & 1) * *(int *)(local_6f0.ray + 0x1c0);
                    *(uint *)(local_6f0.ray + 0x1c4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_6f0.ray + 0x1c4);
                    *(uint *)(local_6f0.ray + 0x1c8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_6f0.ray + 0x1c8);
                    *(uint *)(local_6f0.ray + 0x1cc) =
                         (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_6f0.ray + 0x1cc);
                    *(uint *)(local_6f0.ray + 0x1d0) =
                         (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_6f0.ray + 0x1d0);
                    *(uint *)(local_6f0.ray + 0x1d4) =
                         (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_6f0.ray + 0x1d4);
                    *(uint *)(local_6f0.ray + 0x1d8) =
                         (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_6f0.ray + 0x1d8);
                    *(uint *)(local_6f0.ray + 0x1dc) =
                         (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_6f0.ray + 0x1dc);
                    iVar1 = *(int *)(local_6f0.hit + 100);
                    iVar2 = *(int *)(local_6f0.hit + 0x68);
                    iVar60 = *(int *)(local_6f0.hit + 0x6c);
                    iVar61 = *(int *)(local_6f0.hit + 0x70);
                    iVar62 = *(int *)(local_6f0.hit + 0x74);
                    iVar63 = *(int *)(local_6f0.hit + 0x78);
                    iVar64 = *(int *)(local_6f0.hit + 0x7c);
                    bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
                    bVar19 = SUB81(uVar83 >> 7,0);
                    *(uint *)(local_6f0.ray + 0x1e0) =
                         (uint)(bVar79 & 1) * *(int *)(local_6f0.hit + 0x60) |
                         (uint)!(bool)(bVar79 & 1) * *(int *)(local_6f0.ray + 0x1e0);
                    *(uint *)(local_6f0.ray + 0x1e4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_6f0.ray + 0x1e4);
                    *(uint *)(local_6f0.ray + 0x1e8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_6f0.ray + 0x1e8);
                    *(uint *)(local_6f0.ray + 0x1ec) =
                         (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_6f0.ray + 0x1ec);
                    *(uint *)(local_6f0.ray + 0x1f0) =
                         (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_6f0.ray + 0x1f0);
                    *(uint *)(local_6f0.ray + 500) =
                         (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_6f0.ray + 500);
                    *(uint *)(local_6f0.ray + 0x1f8) =
                         (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_6f0.ray + 0x1f8);
                    *(uint *)(local_6f0.ray + 0x1fc) =
                         (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_6f0.ray + 0x1fc);
                    auVar138._0_4_ =
                         (uint)(bVar79 & 1) * *(int *)(local_6f0.hit + 0x80) |
                         (uint)!(bool)(bVar79 & 1) * *(int *)(local_6f0.ray + 0x200);
                    bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                    auVar138._4_4_ =
                         (uint)bVar13 * *(int *)(local_6f0.hit + 0x84) |
                         (uint)!bVar13 * *(int *)(local_6f0.ray + 0x204);
                    bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
                    auVar138._8_4_ =
                         (uint)bVar13 * *(int *)(local_6f0.hit + 0x88) |
                         (uint)!bVar13 * *(int *)(local_6f0.ray + 0x208);
                    bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
                    auVar138._12_4_ =
                         (uint)bVar13 * *(int *)(local_6f0.hit + 0x8c) |
                         (uint)!bVar13 * *(int *)(local_6f0.ray + 0x20c);
                    bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
                    auVar138._16_4_ =
                         (uint)bVar13 * *(int *)(local_6f0.hit + 0x90) |
                         (uint)!bVar13 * *(int *)(local_6f0.ray + 0x210);
                    bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
                    auVar138._20_4_ =
                         (uint)bVar13 * *(int *)(local_6f0.hit + 0x94) |
                         (uint)!bVar13 * *(int *)(local_6f0.ray + 0x214);
                    bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
                    auVar138._24_4_ =
                         (uint)bVar13 * *(int *)(local_6f0.hit + 0x98) |
                         (uint)!bVar13 * *(int *)(local_6f0.ray + 0x218);
                    bVar13 = SUB81(uVar83 >> 7,0);
                    auVar138._28_4_ =
                         (uint)bVar13 * *(int *)(local_6f0.hit + 0x9c) |
                         (uint)!bVar13 * *(int *)(local_6f0.ray + 0x21c);
                    *(undefined1 (*) [32])(local_6f0.ray + 0x200) = auVar138;
                    auVar125 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_6f0.hit + 0xa0));
                    *(undefined1 (*) [32])(local_6f0.ray + 0x220) = auVar125;
                    auVar125 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_6f0.hit + 0xc0));
                    *(undefined1 (*) [32])(local_6f0.ray + 0x240) = auVar125;
                    auVar125 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_6f0.hit + 0xe0));
                    *(undefined1 (*) [32])(local_6f0.ray + 0x260) = auVar125;
                    auVar125 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_6f0.hit + 0x100));
                    *(undefined1 (*) [32])(local_6f0.ray + 0x280) = auVar125;
                  }
                  auVar214 = ZEXT3264(auVar116);
                  auVar188 = ZEXT3264(auVar186);
                  auVar93 = auVar234._0_16_;
                  bVar79 = ~(byte)(1 << ((uint)uVar80 & 0x1f)) & bVar89;
                  uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar36._4_4_ = uVar149;
                  auVar36._0_4_ = uVar149;
                  auVar36._8_4_ = uVar149;
                  auVar36._12_4_ = uVar149;
                  auVar36._16_4_ = uVar149;
                  auVar36._20_4_ = uVar149;
                  auVar36._24_4_ = uVar149;
                  auVar36._28_4_ = uVar149;
                  uVar164 = vcmpps_avx512vl(auVar186,auVar36,2);
                  bVar89 = bVar79 & (byte)uVar164;
                  if ((bVar79 & (byte)uVar164) != 0) {
                    auVar163._8_4_ = 0x7f800000;
                    auVar163._0_8_ = 0x7f8000007f800000;
                    auVar163._12_4_ = 0x7f800000;
                    auVar163._16_4_ = 0x7f800000;
                    auVar163._20_4_ = 0x7f800000;
                    auVar163._24_4_ = 0x7f800000;
                    auVar163._28_4_ = 0x7f800000;
                    auVar125 = vblendmps_avx512vl(auVar163,auVar186);
                    auVar139._0_4_ =
                         (uint)(bVar89 & 1) * auVar125._0_4_ |
                         (uint)!(bool)(bVar89 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar89 >> 1 & 1);
                    auVar139._4_4_ = (uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar89 >> 2 & 1);
                    auVar139._8_4_ = (uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar89 >> 3 & 1);
                    auVar139._12_4_ = (uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar89 >> 4 & 1);
                    auVar139._16_4_ = (uint)bVar13 * auVar125._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar89 >> 5 & 1);
                    auVar139._20_4_ = (uint)bVar13 * auVar125._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar89 >> 6 & 1);
                    auVar139._24_4_ = (uint)bVar13 * auVar125._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar139._28_4_ =
                         (uint)(bVar89 >> 7) * auVar125._28_4_ |
                         (uint)!(bool)(bVar89 >> 7) * 0x7f800000;
                    auVar125 = vshufps_avx(auVar139,auVar139,0xb1);
                    auVar125 = vminps_avx(auVar139,auVar125);
                    auVar117 = vshufpd_avx(auVar125,auVar125,5);
                    auVar125 = vminps_avx(auVar125,auVar117);
                    auVar117 = vpermpd_avx2(auVar125,0x4e);
                    auVar125 = vminps_avx(auVar125,auVar117);
                    uVar164 = vcmpps_avx512vl(auVar139,auVar125,0);
                    bVar78 = (byte)uVar164 & bVar89;
                    bVar79 = bVar89;
                    if (bVar78 != 0) {
                      bVar79 = bVar78;
                    }
                    uVar82 = 0;
                    for (uVar81 = (uint)bVar79; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000
                        ) {
                      uVar82 = uVar82 + 1;
                    }
                    uVar80 = (ulong)uVar82;
                  }
                } while (bVar89 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar10) {
        local_540 = vpbroadcastd_avx512vl();
        local_580 = vbroadcastss_avx512vl(auVar93);
        fStack_4d0 = 1.0 / local_4e0;
        auStack_4dc._0_4_ = fStack_4d0;
        local_4e0 = fStack_4d0;
        auStack_4dc._4_4_ = fStack_4d0;
        fStack_4d4 = fStack_4d0;
        local_380 = vpbroadcastd_avx512vl();
        local_3a0 = vpbroadcastd_avx512vl();
        lVar87 = 8;
        auVar186 = auVar214._0_32_;
        auVar125 = auVar188._0_32_;
        local_500 = uVar84;
        uStack_4fc = uVar84;
        uStack_4f8 = uVar84;
        uStack_4f4 = uVar84;
        uStack_4f0 = uVar84;
        uStack_4ec = uVar84;
        uStack_4e8 = uVar84;
        uStack_4e4 = uVar84;
        fStack_4cc = fStack_4d0;
        fStack_4c8 = fStack_4d0;
        fStack_4c4 = fStack_4d0;
        do {
          auVar116 = vpbroadcastd_avx512vl();
          auVar100 = vpor_avx2(auVar116,_DAT_0205a920);
          uVar25 = vpcmpd_avx512vl(auVar100,local_540,1);
          auVar116 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar87 * 4 + lVar26);
          auVar117 = *(undefined1 (*) [32])(lVar26 + 0x22307f0 + lVar87 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar26 + 0x2230c74 + lVar87 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar26 + 0x22310f8 + lVar87 * 4);
          local_640 = auVar232._0_32_;
          auVar101 = vmulps_avx512vl(local_640,auVar114);
          local_660 = auVar233._0_32_;
          auVar102 = vmulps_avx512vl(local_660,auVar114);
          auVar41._4_4_ = auVar114._4_4_ * (float)local_120._4_4_;
          auVar41._0_4_ = auVar114._0_4_ * (float)local_120._0_4_;
          auVar41._8_4_ = auVar114._8_4_ * fStack_118;
          auVar41._12_4_ = auVar114._12_4_ * fStack_114;
          auVar41._16_4_ = auVar114._16_4_ * fStack_110;
          auVar41._20_4_ = auVar114._20_4_ * fStack_10c;
          auVar41._24_4_ = auVar114._24_4_ * fStack_108;
          auVar41._28_4_ = auVar100._28_4_;
          auVar100 = vfmadd231ps_avx512vl(auVar101,auVar115,local_c0);
          auVar101 = vfmadd231ps_avx512vl(auVar102,auVar115,local_e0);
          auVar102 = vfmadd231ps_avx512vl(auVar41,auVar115,local_100);
          auVar112 = auVar228._0_32_;
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar117,auVar112);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar117,local_2e0);
          auVar93 = vfmadd231ps_fma(auVar102,auVar117,local_a0);
          auVar119 = auVar230._0_32_;
          auVar105 = vfmadd231ps_avx512vl(auVar100,auVar116,auVar119);
          auVar118 = auVar229._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar101,auVar116,auVar118);
          auVar100 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar87 * 4 + lVar26);
          auVar101 = *(undefined1 (*) [32])(lVar26 + 0x2232c10 + lVar87 * 4);
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar116,local_80);
          auVar102 = *(undefined1 (*) [32])(lVar26 + 0x2233094 + lVar87 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar26 + 0x2233518 + lVar87 * 4);
          auVar103 = vmulps_avx512vl(local_640,auVar113);
          auVar104 = vmulps_avx512vl(local_660,auVar113);
          auVar42._4_4_ = auVar113._4_4_ * (float)local_120._4_4_;
          auVar42._0_4_ = auVar113._0_4_ * (float)local_120._0_4_;
          auVar42._8_4_ = auVar113._8_4_ * fStack_118;
          auVar42._12_4_ = auVar113._12_4_ * fStack_114;
          auVar42._16_4_ = auVar113._16_4_ * fStack_110;
          auVar42._20_4_ = auVar113._20_4_ * fStack_10c;
          auVar42._24_4_ = auVar113._24_4_ * fStack_108;
          auVar42._28_4_ = uStack_104;
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar102,local_c0);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,local_e0);
          auVar107 = vfmadd231ps_avx512vl(auVar42,auVar102,local_100);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar101,auVar112);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,local_2e0);
          auVar97 = vfmadd231ps_fma(auVar107,auVar101,local_a0);
          auVar107 = vfmadd231ps_avx512vl(auVar103,auVar100,auVar119);
          auVar108 = vfmadd231ps_avx512vl(auVar104,auVar100,auVar118);
          auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar100,local_80);
          auVar109 = vmaxps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar97));
          auVar103 = vsubps_avx(auVar107,auVar105);
          auVar104 = vsubps_avx(auVar108,auVar106);
          auVar110 = vmulps_avx512vl(auVar106,auVar103);
          auVar111 = vmulps_avx512vl(auVar105,auVar104);
          auVar110 = vsubps_avx512vl(auVar110,auVar111);
          auVar111 = vmulps_avx512vl(auVar104,auVar104);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar103,auVar103);
          auVar109 = vmulps_avx512vl(auVar109,auVar109);
          auVar109 = vmulps_avx512vl(auVar109,auVar111);
          auVar110 = vmulps_avx512vl(auVar110,auVar110);
          uVar164 = vcmpps_avx512vl(auVar110,auVar109,2);
          local_410 = (byte)uVar25 & (byte)uVar164;
          if (local_410 == 0) {
            auVar229 = ZEXT3264(auVar118);
            auVar228 = ZEXT3264(auVar112);
          }
          else {
            auVar113 = vmulps_avx512vl(local_1a0,auVar113);
            auVar102 = vfmadd213ps_avx512vl(auVar102,local_180,auVar113);
            auVar101 = vfmadd213ps_avx512vl(auVar101,local_160,auVar102);
            auVar100 = vfmadd213ps_avx512vl(auVar100,local_140,auVar101);
            auVar114 = vmulps_avx512vl(local_1a0,auVar114);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_180,auVar114);
            auVar117 = vfmadd213ps_avx512vl(auVar117,local_160,auVar115);
            auVar101 = vfmadd213ps_avx512vl(auVar116,local_140,auVar117);
            auVar116 = *(undefined1 (*) [32])(lVar26 + 0x223157c + lVar87 * 4);
            auVar117 = *(undefined1 (*) [32])(lVar26 + 0x2231a00 + lVar87 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar26 + 0x2231e84 + lVar87 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar26 + 0x2232308 + lVar87 * 4);
            auVar102 = vmulps_avx512vl(local_640,auVar114);
            auVar113 = vmulps_avx512vl(local_660,auVar114);
            auVar114 = vmulps_avx512vl(local_1a0,auVar114);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar115,local_c0);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar115,local_e0);
            auVar115 = vfmadd231ps_avx512vl(auVar114,local_180,auVar115);
            auVar114 = vfmadd231ps_avx512vl(auVar102,auVar117,auVar112);
            auVar102 = vfmadd231ps_avx512vl(auVar113,auVar117,local_2e0);
            auVar117 = vfmadd231ps_avx512vl(auVar115,local_160,auVar117);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar116,auVar119);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar116,auVar118);
            auVar113 = vfmadd231ps_avx512vl(auVar117,local_140,auVar116);
            auVar116 = *(undefined1 (*) [32])(lVar26 + 0x223399c + lVar87 * 4);
            auVar117 = *(undefined1 (*) [32])(lVar26 + 0x22342a4 + lVar87 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar26 + 0x2234728 + lVar87 * 4);
            auVar109 = vmulps_avx512vl(local_640,auVar115);
            auVar110 = vmulps_avx512vl(local_660,auVar115);
            auVar115 = vmulps_avx512vl(local_1a0,auVar115);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar117,local_c0);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar117,local_e0);
            auVar115 = vfmadd231ps_avx512vl(auVar115,local_180,auVar117);
            auVar117 = *(undefined1 (*) [32])(lVar26 + 0x2233e20 + lVar87 * 4);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar117,auVar112);
            auVar154 = vfmadd231ps_fma(auVar110,auVar117,local_2e0);
            auVar117 = vfmadd231ps_avx512vl(auVar115,local_160,auVar117);
            auVar115 = vfmadd231ps_avx512vl(auVar109,auVar116,auVar119);
            auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar154),auVar116,auVar118);
            auVar117 = vfmadd231ps_avx512vl(auVar117,local_140,auVar116);
            auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar114,auVar110);
            vandps_avx512vl(auVar102,auVar110);
            auVar116 = vmaxps_avx(auVar110,auVar110);
            vandps_avx512vl(auVar113,auVar110);
            auVar116 = vmaxps_avx(auVar116,auVar110);
            uVar80 = vcmpps_avx512vl(auVar116,local_580,1);
            bVar13 = (bool)((byte)uVar80 & 1);
            auVar127._0_4_ = (float)((uint)bVar13 * auVar103._0_4_ | (uint)!bVar13 * auVar114._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar13 * auVar103._4_4_ | (uint)!bVar13 * auVar114._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar13 * auVar103._8_4_ | (uint)!bVar13 * auVar114._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar13 * auVar103._12_4_ | (uint)!bVar13 * auVar114._12_4_);
            bVar13 = (bool)((byte)(uVar80 >> 4) & 1);
            auVar127._16_4_ =
                 (float)((uint)bVar13 * auVar103._16_4_ | (uint)!bVar13 * auVar114._16_4_);
            bVar13 = (bool)((byte)(uVar80 >> 5) & 1);
            auVar127._20_4_ =
                 (float)((uint)bVar13 * auVar103._20_4_ | (uint)!bVar13 * auVar114._20_4_);
            bVar13 = (bool)((byte)(uVar80 >> 6) & 1);
            auVar127._24_4_ =
                 (float)((uint)bVar13 * auVar103._24_4_ | (uint)!bVar13 * auVar114._24_4_);
            bVar13 = SUB81(uVar80 >> 7,0);
            auVar127._28_4_ = (uint)bVar13 * auVar103._28_4_ | (uint)!bVar13 * auVar114._28_4_;
            bVar13 = (bool)((byte)uVar80 & 1);
            auVar128._0_4_ = (float)((uint)bVar13 * auVar104._0_4_ | (uint)!bVar13 * auVar102._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar128._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar102._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar128._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar102._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar128._12_4_ =
                 (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar102._12_4_);
            bVar13 = (bool)((byte)(uVar80 >> 4) & 1);
            auVar128._16_4_ =
                 (float)((uint)bVar13 * auVar104._16_4_ | (uint)!bVar13 * auVar102._16_4_);
            bVar13 = (bool)((byte)(uVar80 >> 5) & 1);
            auVar128._20_4_ =
                 (float)((uint)bVar13 * auVar104._20_4_ | (uint)!bVar13 * auVar102._20_4_);
            bVar13 = (bool)((byte)(uVar80 >> 6) & 1);
            auVar128._24_4_ =
                 (float)((uint)bVar13 * auVar104._24_4_ | (uint)!bVar13 * auVar102._24_4_);
            bVar13 = SUB81(uVar80 >> 7,0);
            auVar128._28_4_ = (uint)bVar13 * auVar104._28_4_ | (uint)!bVar13 * auVar102._28_4_;
            vandps_avx512vl(auVar115,auVar110);
            vandps_avx512vl(auVar109,auVar110);
            auVar116 = vmaxps_avx(auVar128,auVar128);
            vandps_avx512vl(auVar117,auVar110);
            auVar116 = vmaxps_avx(auVar116,auVar128);
            uVar80 = vcmpps_avx512vl(auVar116,local_580,1);
            bVar13 = (bool)((byte)uVar80 & 1);
            auVar129._0_4_ = (uint)bVar13 * auVar103._0_4_ | (uint)!bVar13 * auVar115._0_4_;
            bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar129._4_4_ = (uint)bVar13 * auVar103._4_4_ | (uint)!bVar13 * auVar115._4_4_;
            bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar129._8_4_ = (uint)bVar13 * auVar103._8_4_ | (uint)!bVar13 * auVar115._8_4_;
            bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar129._12_4_ = (uint)bVar13 * auVar103._12_4_ | (uint)!bVar13 * auVar115._12_4_;
            bVar13 = (bool)((byte)(uVar80 >> 4) & 1);
            auVar129._16_4_ = (uint)bVar13 * auVar103._16_4_ | (uint)!bVar13 * auVar115._16_4_;
            bVar13 = (bool)((byte)(uVar80 >> 5) & 1);
            auVar129._20_4_ = (uint)bVar13 * auVar103._20_4_ | (uint)!bVar13 * auVar115._20_4_;
            bVar13 = (bool)((byte)(uVar80 >> 6) & 1);
            auVar129._24_4_ = (uint)bVar13 * auVar103._24_4_ | (uint)!bVar13 * auVar115._24_4_;
            bVar13 = SUB81(uVar80 >> 7,0);
            auVar129._28_4_ = (uint)bVar13 * auVar103._28_4_ | (uint)!bVar13 * auVar115._28_4_;
            bVar13 = (bool)((byte)uVar80 & 1);
            auVar130._0_4_ = (float)((uint)bVar13 * auVar104._0_4_ | (uint)!bVar13 * auVar109._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar109._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar109._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar109._12_4_);
            bVar13 = (bool)((byte)(uVar80 >> 4) & 1);
            auVar130._16_4_ =
                 (float)((uint)bVar13 * auVar104._16_4_ | (uint)!bVar13 * auVar109._16_4_);
            bVar13 = (bool)((byte)(uVar80 >> 5) & 1);
            auVar130._20_4_ =
                 (float)((uint)bVar13 * auVar104._20_4_ | (uint)!bVar13 * auVar109._20_4_);
            bVar13 = (bool)((byte)(uVar80 >> 6) & 1);
            auVar130._24_4_ =
                 (float)((uint)bVar13 * auVar104._24_4_ | (uint)!bVar13 * auVar109._24_4_);
            bVar13 = SUB81(uVar80 >> 7,0);
            auVar130._28_4_ = (uint)bVar13 * auVar104._28_4_ | (uint)!bVar13 * auVar109._28_4_;
            auVar220._8_4_ = 0x80000000;
            auVar220._0_8_ = 0x8000000080000000;
            auVar220._12_4_ = 0x80000000;
            auVar220._16_4_ = 0x80000000;
            auVar220._20_4_ = 0x80000000;
            auVar220._24_4_ = 0x80000000;
            auVar220._28_4_ = 0x80000000;
            auVar116 = vxorps_avx512vl(auVar129,auVar220);
            auVar109 = auVar231._0_32_;
            auVar117 = vfmadd213ps_avx512vl(auVar127,auVar127,auVar109);
            auVar154 = vfmadd231ps_fma(auVar117,auVar128,auVar128);
            auVar117 = vrsqrt14ps_avx512vl(ZEXT1632(auVar154));
            auVar227._8_4_ = 0xbf000000;
            auVar227._0_8_ = 0xbf000000bf000000;
            auVar227._12_4_ = 0xbf000000;
            auVar227._16_4_ = 0xbf000000;
            auVar227._20_4_ = 0xbf000000;
            auVar227._24_4_ = 0xbf000000;
            auVar227._28_4_ = 0xbf000000;
            fVar190 = auVar117._0_4_;
            fVar199 = auVar117._4_4_;
            fVar200 = auVar117._8_4_;
            fVar201 = auVar117._12_4_;
            fVar173 = auVar117._16_4_;
            fVar189 = auVar117._20_4_;
            fVar90 = auVar117._24_4_;
            auVar43._4_4_ = fVar199 * fVar199 * fVar199 * auVar154._4_4_ * -0.5;
            auVar43._0_4_ = fVar190 * fVar190 * fVar190 * auVar154._0_4_ * -0.5;
            auVar43._8_4_ = fVar200 * fVar200 * fVar200 * auVar154._8_4_ * -0.5;
            auVar43._12_4_ = fVar201 * fVar201 * fVar201 * auVar154._12_4_ * -0.5;
            auVar43._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
            auVar43._20_4_ = fVar189 * fVar189 * fVar189 * -0.0;
            auVar43._24_4_ = fVar90 * fVar90 * fVar90 * -0.0;
            auVar43._28_4_ = auVar128._28_4_;
            auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar117 = vfmadd231ps_avx512vl(auVar43,auVar115,auVar117);
            auVar44._4_4_ = auVar128._4_4_ * auVar117._4_4_;
            auVar44._0_4_ = auVar128._0_4_ * auVar117._0_4_;
            auVar44._8_4_ = auVar128._8_4_ * auVar117._8_4_;
            auVar44._12_4_ = auVar128._12_4_ * auVar117._12_4_;
            auVar44._16_4_ = auVar128._16_4_ * auVar117._16_4_;
            auVar44._20_4_ = auVar128._20_4_ * auVar117._20_4_;
            auVar44._24_4_ = auVar128._24_4_ * auVar117._24_4_;
            auVar44._28_4_ = 0;
            auVar45._4_4_ = auVar117._4_4_ * -auVar127._4_4_;
            auVar45._0_4_ = auVar117._0_4_ * -auVar127._0_4_;
            auVar45._8_4_ = auVar117._8_4_ * -auVar127._8_4_;
            auVar45._12_4_ = auVar117._12_4_ * -auVar127._12_4_;
            auVar45._16_4_ = auVar117._16_4_ * -auVar127._16_4_;
            auVar45._20_4_ = auVar117._20_4_ * -auVar127._20_4_;
            auVar45._24_4_ = auVar117._24_4_ * -auVar127._24_4_;
            auVar45._28_4_ = auVar128._28_4_;
            auVar114 = vmulps_avx512vl(auVar117,auVar109);
            auVar117 = vfmadd213ps_avx512vl(auVar129,auVar129,auVar109);
            auVar117 = vfmadd231ps_avx512vl(auVar117,auVar130,auVar130);
            auVar102 = vrsqrt14ps_avx512vl(auVar117);
            auVar117 = vmulps_avx512vl(auVar117,auVar227);
            fVar190 = auVar102._0_4_;
            fVar199 = auVar102._4_4_;
            fVar200 = auVar102._8_4_;
            fVar201 = auVar102._12_4_;
            fVar173 = auVar102._16_4_;
            fVar189 = auVar102._20_4_;
            fVar90 = auVar102._24_4_;
            auVar46._4_4_ = fVar199 * fVar199 * fVar199 * auVar117._4_4_;
            auVar46._0_4_ = fVar190 * fVar190 * fVar190 * auVar117._0_4_;
            auVar46._8_4_ = fVar200 * fVar200 * fVar200 * auVar117._8_4_;
            auVar46._12_4_ = fVar201 * fVar201 * fVar201 * auVar117._12_4_;
            auVar46._16_4_ = fVar173 * fVar173 * fVar173 * auVar117._16_4_;
            auVar46._20_4_ = fVar189 * fVar189 * fVar189 * auVar117._20_4_;
            auVar46._24_4_ = fVar90 * fVar90 * fVar90 * auVar117._24_4_;
            auVar46._28_4_ = auVar117._28_4_;
            auVar117 = vfmadd231ps_avx512vl(auVar46,auVar115,auVar102);
            auVar47._4_4_ = auVar130._4_4_ * auVar117._4_4_;
            auVar47._0_4_ = auVar130._0_4_ * auVar117._0_4_;
            auVar47._8_4_ = auVar130._8_4_ * auVar117._8_4_;
            auVar47._12_4_ = auVar130._12_4_ * auVar117._12_4_;
            auVar47._16_4_ = auVar130._16_4_ * auVar117._16_4_;
            auVar47._20_4_ = auVar130._20_4_ * auVar117._20_4_;
            auVar47._24_4_ = auVar130._24_4_ * auVar117._24_4_;
            auVar47._28_4_ = auVar102._28_4_;
            auVar48._4_4_ = auVar117._4_4_ * auVar116._4_4_;
            auVar48._0_4_ = auVar117._0_4_ * auVar116._0_4_;
            auVar48._8_4_ = auVar117._8_4_ * auVar116._8_4_;
            auVar48._12_4_ = auVar117._12_4_ * auVar116._12_4_;
            auVar48._16_4_ = auVar117._16_4_ * auVar116._16_4_;
            auVar48._20_4_ = auVar117._20_4_ * auVar116._20_4_;
            auVar48._24_4_ = auVar117._24_4_ * auVar116._24_4_;
            auVar48._28_4_ = auVar116._28_4_;
            auVar116 = vmulps_avx512vl(auVar117,auVar109);
            auVar154 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar93),auVar105);
            auVar117 = ZEXT1632(auVar93);
            auVar153 = vfmadd213ps_fma(auVar45,auVar117,auVar106);
            auVar115 = vfmadd213ps_avx512vl(auVar114,auVar117,auVar101);
            auVar102 = vfmadd213ps_avx512vl(auVar47,ZEXT1632(auVar97),auVar107);
            auVar98 = vfnmadd213ps_fma(auVar44,auVar117,auVar105);
            auVar113 = ZEXT1632(auVar97);
            auVar96 = vfmadd213ps_fma(auVar48,auVar113,auVar108);
            auVar92 = vfnmadd213ps_fma(auVar45,auVar117,auVar106);
            auVar22 = vfmadd213ps_fma(auVar116,auVar113,auVar100);
            auVar106 = ZEXT1632(auVar93);
            auVar152 = vfnmadd231ps_fma(auVar101,auVar106,auVar114);
            auVar150 = vfnmadd213ps_fma(auVar47,auVar113,auVar107);
            auVar151 = vfnmadd213ps_fma(auVar48,auVar113,auVar108);
            auVar99 = vfnmadd231ps_fma(auVar100,ZEXT1632(auVar97),auVar116);
            auVar100 = vsubps_avx512vl(auVar102,ZEXT1632(auVar98));
            auVar116 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar92));
            auVar117 = vsubps_avx(ZEXT1632(auVar22),ZEXT1632(auVar152));
            auVar49._4_4_ = auVar116._4_4_ * auVar152._4_4_;
            auVar49._0_4_ = auVar116._0_4_ * auVar152._0_4_;
            auVar49._8_4_ = auVar116._8_4_ * auVar152._8_4_;
            auVar49._12_4_ = auVar116._12_4_ * auVar152._12_4_;
            auVar49._16_4_ = auVar116._16_4_ * 0.0;
            auVar49._20_4_ = auVar116._20_4_ * 0.0;
            auVar49._24_4_ = auVar116._24_4_ * 0.0;
            auVar49._28_4_ = auVar114._28_4_;
            auVar93 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar92),auVar117);
            auVar50._4_4_ = auVar117._4_4_ * auVar98._4_4_;
            auVar50._0_4_ = auVar117._0_4_ * auVar98._0_4_;
            auVar50._8_4_ = auVar117._8_4_ * auVar98._8_4_;
            auVar50._12_4_ = auVar117._12_4_ * auVar98._12_4_;
            auVar50._16_4_ = auVar117._16_4_ * 0.0;
            auVar50._20_4_ = auVar117._20_4_ * 0.0;
            auVar50._24_4_ = auVar117._24_4_ * 0.0;
            auVar50._28_4_ = auVar117._28_4_;
            auVar23 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar152),auVar100);
            auVar51._4_4_ = auVar92._4_4_ * auVar100._4_4_;
            auVar51._0_4_ = auVar92._0_4_ * auVar100._0_4_;
            auVar51._8_4_ = auVar92._8_4_ * auVar100._8_4_;
            auVar51._12_4_ = auVar92._12_4_ * auVar100._12_4_;
            auVar51._16_4_ = auVar100._16_4_ * 0.0;
            auVar51._20_4_ = auVar100._20_4_ * 0.0;
            auVar51._24_4_ = auVar100._24_4_ * 0.0;
            auVar51._28_4_ = auVar100._28_4_;
            auVar94 = vfmsub231ps_fma(auVar51,ZEXT1632(auVar98),auVar116);
            auVar116 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar109,ZEXT1632(auVar23));
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar109,ZEXT1632(auVar93));
            uVar80 = vcmpps_avx512vl(auVar116,auVar109,2);
            bVar89 = (byte)uVar80;
            fVar141 = (float)((uint)(bVar89 & 1) * auVar154._0_4_ |
                             (uint)!(bool)(bVar89 & 1) * auVar150._0_4_);
            bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
            fVar143 = (float)((uint)bVar13 * auVar154._4_4_ | (uint)!bVar13 * auVar150._4_4_);
            bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
            fVar146 = (float)((uint)bVar13 * auVar154._8_4_ | (uint)!bVar13 * auVar150._8_4_);
            bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
            fVar147 = (float)((uint)bVar13 * auVar154._12_4_ | (uint)!bVar13 * auVar150._12_4_);
            auVar113 = ZEXT1632(CONCAT412(fVar147,CONCAT48(fVar146,CONCAT44(fVar143,fVar141))));
            fVar142 = (float)((uint)(bVar89 & 1) * auVar153._0_4_ |
                             (uint)!(bool)(bVar89 & 1) * auVar151._0_4_);
            bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
            fVar145 = (float)((uint)bVar13 * auVar153._4_4_ | (uint)!bVar13 * auVar151._4_4_);
            bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
            fVar144 = (float)((uint)bVar13 * auVar153._8_4_ | (uint)!bVar13 * auVar151._8_4_);
            bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
            fVar148 = (float)((uint)bVar13 * auVar153._12_4_ | (uint)!bVar13 * auVar151._12_4_);
            auVar103 = ZEXT1632(CONCAT412(fVar148,CONCAT48(fVar144,CONCAT44(fVar145,fVar142))));
            auVar131._0_4_ =
                 (float)((uint)(bVar89 & 1) * auVar115._0_4_ |
                        (uint)!(bool)(bVar89 & 1) * auVar99._0_4_);
            bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar99._4_4_);
            bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar99._8_4_);
            bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar99._12_4_);
            fVar200 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar115._16_4_);
            auVar131._16_4_ = fVar200;
            fVar199 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar115._20_4_);
            auVar131._20_4_ = fVar199;
            fVar190 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar115._24_4_);
            auVar131._24_4_ = fVar190;
            iVar1 = (uint)(byte)(uVar80 >> 7) * auVar115._28_4_;
            auVar131._28_4_ = iVar1;
            auVar116 = vblendmps_avx512vl(ZEXT1632(auVar98),auVar102);
            auVar132._0_4_ =
                 (uint)(bVar89 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar89 & 1) * auVar93._0_4_;
            bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar132._4_4_ = (uint)bVar13 * auVar116._4_4_ | (uint)!bVar13 * auVar93._4_4_;
            bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar132._8_4_ = (uint)bVar13 * auVar116._8_4_ | (uint)!bVar13 * auVar93._8_4_;
            bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar132._12_4_ = (uint)bVar13 * auVar116._12_4_ | (uint)!bVar13 * auVar93._12_4_;
            auVar132._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * auVar116._16_4_;
            auVar132._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * auVar116._20_4_;
            auVar132._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * auVar116._24_4_;
            auVar132._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar116._28_4_;
            auVar116 = vblendmps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar96));
            auVar133._0_4_ =
                 (float)((uint)(bVar89 & 1) * auVar116._0_4_ |
                        (uint)!(bool)(bVar89 & 1) * auVar154._0_4_);
            bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar13 * auVar116._4_4_ | (uint)!bVar13 * auVar154._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar13 * auVar116._8_4_ | (uint)!bVar13 * auVar154._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar13 * auVar116._12_4_ | (uint)!bVar13 * auVar154._12_4_);
            fVar189 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar116._16_4_);
            auVar133._16_4_ = fVar189;
            fVar201 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar116._20_4_);
            auVar133._20_4_ = fVar201;
            fVar173 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar116._24_4_);
            auVar133._24_4_ = fVar173;
            auVar133._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar116._28_4_;
            auVar116 = vblendmps_avx512vl(ZEXT1632(auVar152),ZEXT1632(auVar22));
            auVar134._0_4_ =
                 (float)((uint)(bVar89 & 1) * auVar116._0_4_ |
                        (uint)!(bool)(bVar89 & 1) * auVar153._0_4_);
            bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar134._4_4_ = (float)((uint)bVar13 * auVar116._4_4_ | (uint)!bVar13 * auVar153._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar134._8_4_ = (float)((uint)bVar13 * auVar116._8_4_ | (uint)!bVar13 * auVar153._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar134._12_4_ =
                 (float)((uint)bVar13 * auVar116._12_4_ | (uint)!bVar13 * auVar153._12_4_);
            fVar91 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar116._16_4_);
            auVar134._16_4_ = fVar91;
            fVar140 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar116._20_4_);
            auVar134._20_4_ = fVar140;
            fVar90 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar116._24_4_);
            auVar134._24_4_ = fVar90;
            iVar2 = (uint)(byte)(uVar80 >> 7) * auVar116._28_4_;
            auVar134._28_4_ = iVar2;
            auVar135._0_4_ =
                 (uint)(bVar89 & 1) * (int)auVar98._0_4_ |
                 (uint)!(bool)(bVar89 & 1) * auVar102._0_4_;
            bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar135._4_4_ = (uint)bVar13 * (int)auVar98._4_4_ | (uint)!bVar13 * auVar102._4_4_;
            bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar135._8_4_ = (uint)bVar13 * (int)auVar98._8_4_ | (uint)!bVar13 * auVar102._8_4_;
            bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar135._12_4_ = (uint)bVar13 * (int)auVar98._12_4_ | (uint)!bVar13 * auVar102._12_4_;
            auVar135._16_4_ = (uint)!(bool)((byte)(uVar80 >> 4) & 1) * auVar102._16_4_;
            auVar135._20_4_ = (uint)!(bool)((byte)(uVar80 >> 5) & 1) * auVar102._20_4_;
            auVar135._24_4_ = (uint)!(bool)((byte)(uVar80 >> 6) & 1) * auVar102._24_4_;
            auVar135._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar102._28_4_;
            bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar80 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar102 = vsubps_avx512vl(auVar135,auVar113);
            auVar117 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar92._12_4_ |
                                                     (uint)!bVar17 * auVar96._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar92._8_4_ |
                                                              (uint)!bVar15 * auVar96._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar92._4_4_ |
                                                                       (uint)!bVar13 * auVar96._4_4_
                                                                       ,(uint)(bVar89 & 1) *
                                                                        (int)auVar92._0_4_ |
                                                                        (uint)!(bool)(bVar89 & 1) *
                                                                        auVar96._0_4_)))),auVar103);
            auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar152._12_4_ |
                                                     (uint)!bVar18 * auVar22._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar152._8_4_ |
                                                              (uint)!bVar16 * auVar22._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar152._4_4_ |
                                                                       (uint)!bVar14 * auVar22._4_4_
                                                                       ,(uint)(bVar89 & 1) *
                                                                        (int)auVar152._0_4_ |
                                                                        (uint)!(bool)(bVar89 & 1) *
                                                                        auVar22._0_4_)))),auVar131);
            auVar114 = vsubps_avx(auVar113,auVar132);
            auVar100 = vsubps_avx(auVar103,auVar133);
            auVar101 = vsubps_avx(auVar131,auVar134);
            auVar52._4_4_ = auVar115._4_4_ * fVar143;
            auVar52._0_4_ = auVar115._0_4_ * fVar141;
            auVar52._8_4_ = auVar115._8_4_ * fVar146;
            auVar52._12_4_ = auVar115._12_4_ * fVar147;
            auVar52._16_4_ = auVar115._16_4_ * 0.0;
            auVar52._20_4_ = auVar115._20_4_ * 0.0;
            auVar52._24_4_ = auVar115._24_4_ * 0.0;
            auVar52._28_4_ = 0;
            auVar93 = vfmsub231ps_fma(auVar52,auVar131,auVar102);
            auVar187._0_4_ = fVar142 * auVar102._0_4_;
            auVar187._4_4_ = fVar145 * auVar102._4_4_;
            auVar187._8_4_ = fVar144 * auVar102._8_4_;
            auVar187._12_4_ = fVar148 * auVar102._12_4_;
            auVar187._16_4_ = auVar102._16_4_ * 0.0;
            auVar187._20_4_ = auVar102._20_4_ * 0.0;
            auVar187._24_4_ = auVar102._24_4_ * 0.0;
            auVar187._28_4_ = 0;
            auVar154 = vfmsub231ps_fma(auVar187,auVar113,auVar117);
            auVar116 = vfmadd231ps_avx512vl(ZEXT1632(auVar154),auVar109,ZEXT1632(auVar93));
            auVar195._0_4_ = auVar117._0_4_ * auVar131._0_4_;
            auVar195._4_4_ = auVar117._4_4_ * auVar131._4_4_;
            auVar195._8_4_ = auVar117._8_4_ * auVar131._8_4_;
            auVar195._12_4_ = auVar117._12_4_ * auVar131._12_4_;
            auVar195._16_4_ = auVar117._16_4_ * fVar200;
            auVar195._20_4_ = auVar117._20_4_ * fVar199;
            auVar195._24_4_ = auVar117._24_4_ * fVar190;
            auVar195._28_4_ = 0;
            auVar93 = vfmsub231ps_fma(auVar195,auVar103,auVar115);
            auVar104 = vfmadd231ps_avx512vl(auVar116,auVar109,ZEXT1632(auVar93));
            auVar116 = vmulps_avx512vl(auVar101,auVar132);
            auVar116 = vfmsub231ps_avx512vl(auVar116,auVar114,auVar134);
            auVar53._4_4_ = auVar100._4_4_ * auVar134._4_4_;
            auVar53._0_4_ = auVar100._0_4_ * auVar134._0_4_;
            auVar53._8_4_ = auVar100._8_4_ * auVar134._8_4_;
            auVar53._12_4_ = auVar100._12_4_ * auVar134._12_4_;
            auVar53._16_4_ = auVar100._16_4_ * fVar91;
            auVar53._20_4_ = auVar100._20_4_ * fVar140;
            auVar53._24_4_ = auVar100._24_4_ * fVar90;
            auVar53._28_4_ = iVar2;
            auVar93 = vfmsub231ps_fma(auVar53,auVar133,auVar101);
            auVar196._0_4_ = auVar133._0_4_ * auVar114._0_4_;
            auVar196._4_4_ = auVar133._4_4_ * auVar114._4_4_;
            auVar196._8_4_ = auVar133._8_4_ * auVar114._8_4_;
            auVar196._12_4_ = auVar133._12_4_ * auVar114._12_4_;
            auVar196._16_4_ = fVar189 * auVar114._16_4_;
            auVar196._20_4_ = fVar201 * auVar114._20_4_;
            auVar196._24_4_ = fVar173 * auVar114._24_4_;
            auVar196._28_4_ = 0;
            auVar154 = vfmsub231ps_fma(auVar196,auVar100,auVar132);
            auVar116 = vfmadd231ps_avx512vl(ZEXT1632(auVar154),auVar109,auVar116);
            auVar105 = vfmadd231ps_avx512vl(auVar116,auVar109,ZEXT1632(auVar93));
            auVar116 = vmaxps_avx(auVar104,auVar105);
            uVar164 = vcmpps_avx512vl(auVar116,auVar109,2);
            local_410 = local_410 & (byte)uVar164;
            if (local_410 == 0) {
LAB_01b678a1:
              local_410 = 0;
            }
            else {
              auVar54._4_4_ = auVar101._4_4_ * auVar117._4_4_;
              auVar54._0_4_ = auVar101._0_4_ * auVar117._0_4_;
              auVar54._8_4_ = auVar101._8_4_ * auVar117._8_4_;
              auVar54._12_4_ = auVar101._12_4_ * auVar117._12_4_;
              auVar54._16_4_ = auVar101._16_4_ * auVar117._16_4_;
              auVar54._20_4_ = auVar101._20_4_ * auVar117._20_4_;
              auVar54._24_4_ = auVar101._24_4_ * auVar117._24_4_;
              auVar54._28_4_ = auVar116._28_4_;
              auVar153 = vfmsub231ps_fma(auVar54,auVar100,auVar115);
              auVar55._4_4_ = auVar115._4_4_ * auVar114._4_4_;
              auVar55._0_4_ = auVar115._0_4_ * auVar114._0_4_;
              auVar55._8_4_ = auVar115._8_4_ * auVar114._8_4_;
              auVar55._12_4_ = auVar115._12_4_ * auVar114._12_4_;
              auVar55._16_4_ = auVar115._16_4_ * auVar114._16_4_;
              auVar55._20_4_ = auVar115._20_4_ * auVar114._20_4_;
              auVar55._24_4_ = auVar115._24_4_ * auVar114._24_4_;
              auVar55._28_4_ = auVar115._28_4_;
              auVar154 = vfmsub231ps_fma(auVar55,auVar102,auVar101);
              auVar56._4_4_ = auVar100._4_4_ * auVar102._4_4_;
              auVar56._0_4_ = auVar100._0_4_ * auVar102._0_4_;
              auVar56._8_4_ = auVar100._8_4_ * auVar102._8_4_;
              auVar56._12_4_ = auVar100._12_4_ * auVar102._12_4_;
              auVar56._16_4_ = auVar100._16_4_ * auVar102._16_4_;
              auVar56._20_4_ = auVar100._20_4_ * auVar102._20_4_;
              auVar56._24_4_ = auVar100._24_4_ * auVar102._24_4_;
              auVar56._28_4_ = auVar100._28_4_;
              auVar96 = vfmsub231ps_fma(auVar56,auVar114,auVar117);
              auVar93 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar154),ZEXT1632(auVar96));
              auVar116 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar153),auVar109);
              auVar117 = vrcp14ps_avx512vl(auVar116);
              auVar31._8_4_ = 0x3f800000;
              auVar31._0_8_ = &DAT_3f8000003f800000;
              auVar31._12_4_ = 0x3f800000;
              auVar31._16_4_ = 0x3f800000;
              auVar31._20_4_ = 0x3f800000;
              auVar31._24_4_ = 0x3f800000;
              auVar31._28_4_ = 0x3f800000;
              auVar115 = vfnmadd213ps_avx512vl(auVar117,auVar116,auVar31);
              auVar93 = vfmadd132ps_fma(auVar115,auVar117,auVar117);
              auVar57._4_4_ = auVar96._4_4_ * auVar131._4_4_;
              auVar57._0_4_ = auVar96._0_4_ * auVar131._0_4_;
              auVar57._8_4_ = auVar96._8_4_ * auVar131._8_4_;
              auVar57._12_4_ = auVar96._12_4_ * auVar131._12_4_;
              auVar57._16_4_ = fVar200 * 0.0;
              auVar57._20_4_ = fVar199 * 0.0;
              auVar57._24_4_ = fVar190 * 0.0;
              auVar57._28_4_ = iVar1;
              auVar154 = vfmadd231ps_fma(auVar57,auVar103,ZEXT1632(auVar154));
              auVar154 = vfmadd231ps_fma(ZEXT1632(auVar154),auVar113,ZEXT1632(auVar153));
              fVar190 = auVar93._0_4_;
              fVar199 = auVar93._4_4_;
              fVar200 = auVar93._8_4_;
              fVar201 = auVar93._12_4_;
              auVar117 = ZEXT1632(CONCAT412(auVar154._12_4_ * fVar201,
                                            CONCAT48(auVar154._8_4_ * fVar200,
                                                     CONCAT44(auVar154._4_4_ * fVar199,
                                                              auVar154._0_4_ * fVar190))));
              auVar77._4_4_ = uStack_4fc;
              auVar77._0_4_ = local_500;
              auVar77._8_4_ = uStack_4f8;
              auVar77._12_4_ = uStack_4f4;
              auVar77._16_4_ = uStack_4f0;
              auVar77._20_4_ = uStack_4ec;
              auVar77._24_4_ = uStack_4e8;
              auVar77._28_4_ = uStack_4e4;
              uVar164 = vcmpps_avx512vl(auVar117,auVar77,0xd);
              uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar32._4_4_ = uVar149;
              auVar32._0_4_ = uVar149;
              auVar32._8_4_ = uVar149;
              auVar32._12_4_ = uVar149;
              auVar32._16_4_ = uVar149;
              auVar32._20_4_ = uVar149;
              auVar32._24_4_ = uVar149;
              auVar32._28_4_ = uVar149;
              uVar25 = vcmpps_avx512vl(auVar117,auVar32,2);
              local_410 = (byte)uVar164 & (byte)uVar25 & local_410;
              if (local_410 == 0) goto LAB_01b678a1;
              uVar164 = vcmpps_avx512vl(auVar116,auVar109,4);
              if ((local_410 & (byte)uVar164) == 0) {
                local_410 = 0;
              }
              else {
                local_410 = local_410 & (byte)uVar164;
                fVar173 = auVar104._0_4_ * fVar190;
                fVar189 = auVar104._4_4_ * fVar199;
                auVar58._4_4_ = fVar189;
                auVar58._0_4_ = fVar173;
                fVar90 = auVar104._8_4_ * fVar200;
                auVar58._8_4_ = fVar90;
                fVar91 = auVar104._12_4_ * fVar201;
                auVar58._12_4_ = fVar91;
                fVar140 = auVar104._16_4_ * 0.0;
                auVar58._16_4_ = fVar140;
                fVar141 = auVar104._20_4_ * 0.0;
                auVar58._20_4_ = fVar141;
                fVar142 = auVar104._24_4_ * 0.0;
                auVar58._24_4_ = fVar142;
                auVar58._28_4_ = auVar104._28_4_;
                fVar190 = auVar105._0_4_ * fVar190;
                fVar199 = auVar105._4_4_ * fVar199;
                auVar59._4_4_ = fVar199;
                auVar59._0_4_ = fVar190;
                fVar200 = auVar105._8_4_ * fVar200;
                auVar59._8_4_ = fVar200;
                fVar201 = auVar105._12_4_ * fVar201;
                auVar59._12_4_ = fVar201;
                fVar143 = auVar105._16_4_ * 0.0;
                auVar59._16_4_ = fVar143;
                fVar145 = auVar105._20_4_ * 0.0;
                auVar59._20_4_ = fVar145;
                fVar146 = auVar105._24_4_ * 0.0;
                auVar59._24_4_ = fVar146;
                auVar59._28_4_ = auVar105._28_4_;
                auVar208._8_4_ = 0x3f800000;
                auVar208._0_8_ = &DAT_3f8000003f800000;
                auVar208._12_4_ = 0x3f800000;
                auVar208._16_4_ = 0x3f800000;
                auVar208._20_4_ = 0x3f800000;
                auVar208._24_4_ = 0x3f800000;
                auVar208._28_4_ = 0x3f800000;
                auVar116 = vsubps_avx512vl(auVar208,auVar58);
                bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar80 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar80 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar80 >> 6) & 1);
                bVar19 = SUB81(uVar80 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar19 * auVar104._28_4_ |
                                              (uint)!bVar19 * auVar116._28_4_,
                                              CONCAT424((uint)bVar18 * (int)fVar142 |
                                                        (uint)!bVar18 * auVar116._24_4_,
                                                        CONCAT420((uint)bVar17 * (int)fVar141 |
                                                                  (uint)!bVar17 * auVar116._20_4_,
                                                                  CONCAT416((uint)bVar16 *
                                                                            (int)fVar140 |
                                                                            (uint)!bVar16 *
                                                                            auVar116._16_4_,
                                                                            CONCAT412((uint)bVar15 *
                                                                                      (int)fVar91 |
                                                                                      (uint)!bVar15
                                                                                      * auVar116.
                                                  _12_4_,CONCAT48((uint)bVar14 * (int)fVar90 |
                                                                  (uint)!bVar14 * auVar116._8_4_,
                                                                  CONCAT44((uint)bVar13 *
                                                                           (int)fVar189 |
                                                                           (uint)!bVar13 *
                                                                           auVar116._4_4_,
                                                                           (uint)(bVar89 & 1) *
                                                                           (int)fVar173 |
                                                                           (uint)!(bool)(bVar89 & 1)
                                                                           * auVar116._0_4_))))))));
                auVar116 = vsubps_avx(auVar208,auVar59);
                bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar80 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar80 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar80 >> 6) & 1);
                bVar19 = SUB81(uVar80 >> 7,0);
                local_360._4_4_ = (uint)bVar13 * (int)fVar199 | (uint)!bVar13 * auVar116._4_4_;
                local_360._0_4_ =
                     (uint)(bVar89 & 1) * (int)fVar190 | (uint)!(bool)(bVar89 & 1) * auVar116._0_4_;
                local_360._8_4_ = (uint)bVar14 * (int)fVar200 | (uint)!bVar14 * auVar116._8_4_;
                local_360._12_4_ = (uint)bVar15 * (int)fVar201 | (uint)!bVar15 * auVar116._12_4_;
                local_360._16_4_ = (uint)bVar16 * (int)fVar143 | (uint)!bVar16 * auVar116._16_4_;
                local_360._20_4_ = (uint)bVar17 * (int)fVar145 | (uint)!bVar17 * auVar116._20_4_;
                local_360._24_4_ = (uint)bVar18 * (int)fVar146 | (uint)!bVar18 * auVar116._24_4_;
                local_360._28_4_ = (uint)bVar19 * auVar105._28_4_ | (uint)!bVar19 * auVar116._28_4_;
                in_ZMM21 = ZEXT3264(auVar117);
              }
            }
            auVar229 = ZEXT3264(local_680);
            auVar228 = ZEXT3264(local_6a0);
            if (local_410 != 0) {
              auVar116 = vsubps_avx(ZEXT1632(auVar97),auVar106);
              local_600 = in_ZMM20._0_32_;
              auVar116 = vfmadd213ps_avx512vl(auVar116,local_600,auVar106);
              auVar159._0_4_ = auVar116._0_4_ + auVar116._0_4_;
              auVar159._4_4_ = auVar116._4_4_ + auVar116._4_4_;
              auVar159._8_4_ = auVar116._8_4_ + auVar116._8_4_;
              auVar159._12_4_ = auVar116._12_4_ + auVar116._12_4_;
              auVar159._16_4_ = auVar116._16_4_ + auVar116._16_4_;
              auVar159._20_4_ = auVar116._20_4_ + auVar116._20_4_;
              auVar159._24_4_ = auVar116._24_4_ + auVar116._24_4_;
              auVar159._28_4_ = auVar116._28_4_ + auVar116._28_4_;
              uVar149 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar33._4_4_ = uVar149;
              auVar33._0_4_ = uVar149;
              auVar33._8_4_ = uVar149;
              auVar33._12_4_ = uVar149;
              auVar33._16_4_ = uVar149;
              auVar33._20_4_ = uVar149;
              auVar33._24_4_ = uVar149;
              auVar33._28_4_ = uVar149;
              auVar116 = vmulps_avx512vl(auVar159,auVar33);
              local_620 = in_ZMM21._0_32_;
              uVar164 = vcmpps_avx512vl(local_620,auVar116,6);
              local_410 = local_410 & (byte)uVar164;
              uVar84 = (uint)local_410;
              if (local_410 != 0) {
                auVar160._8_4_ = 0xbf800000;
                auVar160._0_8_ = 0xbf800000bf800000;
                auVar160._12_4_ = 0xbf800000;
                auVar160._16_4_ = 0xbf800000;
                auVar160._20_4_ = 0xbf800000;
                auVar160._24_4_ = 0xbf800000;
                auVar160._28_4_ = 0xbf800000;
                auVar34._8_4_ = 0x40000000;
                auVar34._0_8_ = 0x4000000040000000;
                auVar34._12_4_ = 0x40000000;
                auVar34._16_4_ = 0x40000000;
                auVar34._20_4_ = 0x40000000;
                auVar34._24_4_ = 0x40000000;
                auVar34._28_4_ = 0x40000000;
                local_4a0 = vfmadd132ps_avx512vl(local_360,auVar160,auVar34);
                local_360 = local_4a0;
                auVar116 = local_360;
                local_460 = (undefined4)lVar87;
                local_420 = CONCAT44(fStack_6bc,local_6c0);
                uStack_418 = CONCAT44(fStack_6b4,fStack_6b8);
                pGVar85 = (context->scene->geometries).items[uVar86].ptr;
                local_360 = auVar116;
                if ((pGVar85->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar116 = vaddps_avx512vl(local_600,_DAT_02020f40);
                  auVar93 = vcvtsi2ss_avx512f(local_c0._0_16_,local_460);
                  fVar190 = auVar93._0_4_;
                  local_400[0] = (fVar190 + auVar116._0_4_) * local_4e0;
                  local_400[1] = (fVar190 + auVar116._4_4_) * (float)auStack_4dc._0_4_;
                  local_400[2] = (fVar190 + auVar116._8_4_) * (float)auStack_4dc._4_4_;
                  local_400[3] = (fVar190 + auVar116._12_4_) * fStack_4d4;
                  fStack_3f0 = (fVar190 + auVar116._16_4_) * fStack_4d0;
                  fStack_3ec = (fVar190 + auVar116._20_4_) * fStack_4cc;
                  fStack_3e8 = (fVar190 + auVar116._24_4_) * fStack_4c8;
                  fStack_3e4 = fVar190 + auVar116._28_4_;
                  local_360._0_8_ = local_4a0._0_8_;
                  local_360._8_8_ = local_4a0._8_8_;
                  local_360._16_8_ = local_4a0._16_8_;
                  local_360._24_8_ = local_4a0._24_8_;
                  local_3e0 = local_360._0_8_;
                  uStack_3d8 = local_360._8_8_;
                  uStack_3d0 = local_360._16_8_;
                  uStack_3c8 = local_360._24_8_;
                  local_3c0 = local_620;
                  auVar161._8_4_ = 0x7f800000;
                  auVar161._0_8_ = 0x7f8000007f800000;
                  auVar161._12_4_ = 0x7f800000;
                  auVar161._16_4_ = 0x7f800000;
                  auVar161._20_4_ = 0x7f800000;
                  auVar161._24_4_ = 0x7f800000;
                  auVar161._28_4_ = 0x7f800000;
                  auVar116 = vblendmps_avx512vl(auVar161,local_620);
                  auVar136._0_4_ =
                       (uint)(local_410 & 1) * auVar116._0_4_ |
                       (uint)!(bool)(local_410 & 1) * 0x7f800000;
                  bVar13 = (bool)(local_410 >> 1 & 1);
                  auVar136._4_4_ = (uint)bVar13 * auVar116._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_410 >> 2 & 1);
                  auVar136._8_4_ = (uint)bVar13 * auVar116._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_410 >> 3 & 1);
                  auVar136._12_4_ = (uint)bVar13 * auVar116._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_410 >> 4 & 1);
                  auVar136._16_4_ = (uint)bVar13 * auVar116._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_410 >> 5 & 1);
                  auVar136._20_4_ = (uint)bVar13 * auVar116._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_410 >> 6 & 1);
                  auVar136._24_4_ = (uint)bVar13 * auVar116._24_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar136._28_4_ =
                       (uint)(local_410 >> 7) * auVar116._28_4_ |
                       (uint)!(bool)(local_410 >> 7) * 0x7f800000;
                  auVar116 = vshufps_avx(auVar136,auVar136,0xb1);
                  auVar116 = vminps_avx(auVar136,auVar116);
                  auVar117 = vshufpd_avx(auVar116,auVar116,5);
                  auVar116 = vminps_avx(auVar116,auVar117);
                  auVar117 = vpermpd_avx2(auVar116,0x4e);
                  auVar116 = vminps_avx(auVar116,auVar117);
                  uVar164 = vcmpps_avx512vl(auVar136,auVar116,0);
                  bVar79 = (byte)uVar164 & local_410;
                  bVar89 = local_410;
                  if (bVar79 != 0) {
                    bVar89 = bVar79;
                  }
                  uVar82 = 0;
                  for (uVar81 = (uint)bVar89; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000)
                  {
                    uVar82 = uVar82 + 1;
                  }
                  uVar80 = (ulong)uVar82;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar85->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar190 = local_400[uVar80];
                    uVar149 = *(undefined4 *)((long)&local_3e0 + uVar80 * 4);
                    fVar199 = 1.0 - fVar190;
                    auVar153 = vfnmadd231ss_fma(ZEXT416((uint)(fVar190 * (fVar199 + fVar199))),
                                                ZEXT416((uint)fVar199),ZEXT416((uint)fVar199));
                    auVar154 = ZEXT416((uint)fVar190);
                    auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar154,
                                              ZEXT416(0xc0a00000));
                    auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190 * 3.0)),
                                              ZEXT416((uint)(fVar190 + fVar190)),auVar93);
                    auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar154,
                                              ZEXT416(0x40000000));
                    auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar199 * fVar199 * -3.0)),
                                              ZEXT416((uint)(fVar199 + fVar199)),auVar93);
                    auVar154 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190)),auVar154,
                                               ZEXT416((uint)(fVar199 * -2.0)));
                    fVar199 = auVar153._0_4_ * 0.5;
                    fVar200 = auVar97._0_4_ * 0.5;
                    fVar201 = auVar93._0_4_ * 0.5;
                    fVar173 = auVar154._0_4_ * 0.5;
                    auVar180._0_4_ = fVar173 * local_6c0;
                    auVar180._4_4_ = fVar173 * fStack_6bc;
                    auVar180._8_4_ = fVar173 * fStack_6b8;
                    auVar180._12_4_ = fVar173 * fStack_6b4;
                    auVar204._4_4_ = fVar201;
                    auVar204._0_4_ = fVar201;
                    auVar204._8_4_ = fVar201;
                    auVar204._12_4_ = fVar201;
                    auVar93 = vfmadd132ps_fma(auVar204,auVar180,auVar20);
                    auVar181._4_4_ = fVar200;
                    auVar181._0_4_ = fVar200;
                    auVar181._8_4_ = fVar200;
                    auVar181._12_4_ = fVar200;
                    auVar93 = vfmadd132ps_fma(auVar181,auVar93,auVar21);
                    auVar172._4_4_ = fVar199;
                    auVar172._0_4_ = fVar199;
                    auVar172._8_4_ = fVar199;
                    auVar172._12_4_ = fVar199;
                    auVar93 = vfmadd213ps_fma(auVar172,auVar95,auVar93);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar80 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar93._0_4_;
                    uVar11 = vextractps_avx(auVar93,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar11;
                    uVar11 = vextractps_avx(auVar93,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar11;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar190;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar149;
                    *(uint *)(ray + k * 4 + 0x220) = uVar9;
                    *(uint *)(ray + k * 4 + 0x240) = uVar86;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    local_5c0 = (float)uVar66;
                    fStack_5bc = (float)((ulong)uVar66 >> 0x20);
                    fStack_5b8 = (float)uVar67;
                    fStack_5b4 = (float)((ulong)uVar67 >> 0x20);
                    local_320 = local_420;
                    uStack_318 = uStack_418;
                    local_6b0 = pGVar85;
                    local_5b0 = uVar24;
                    uStack_5a8 = uVar65;
                    local_4c0 = local_600;
                    local_480 = local_620;
                    local_45c = iVar10;
                    local_450 = auVar95;
                    local_440 = uVar24;
                    uStack_438 = uVar65;
                    local_430 = uVar66;
                    uStack_428 = uVar67;
                    do {
                      auVar96 = auVar231._0_16_;
                      local_5a0 = *(undefined4 *)(ray + k * 4 + 0x100);
                      fVar190 = local_400[uVar80];
                      auVar166._4_4_ = fVar190;
                      auVar166._0_4_ = fVar190;
                      auVar166._8_4_ = fVar190;
                      auVar166._12_4_ = fVar190;
                      local_260._16_4_ = fVar190;
                      local_260._0_16_ = auVar166;
                      local_260._20_4_ = fVar190;
                      local_260._24_4_ = fVar190;
                      local_260._28_4_ = fVar190;
                      local_240 = *(undefined4 *)((long)&local_3e0 + uVar80 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar80 * 4)
                      ;
                      local_6f0.context = context->user;
                      fVar199 = 1.0 - fVar190;
                      auVar153 = vfnmadd231ss_fma(ZEXT416((uint)(fVar190 * (fVar199 + fVar199))),
                                                  ZEXT416((uint)fVar199),ZEXT416((uint)fVar199));
                      auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar166,
                                                ZEXT416(0xc0a00000));
                      auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190 * 3.0)),
                                                ZEXT416((uint)(fVar190 + fVar190)),auVar93);
                      auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar166,
                                                ZEXT416(0x40000000));
                      auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar199 * fVar199 * -3.0)),
                                                ZEXT416((uint)(fVar199 + fVar199)),auVar93);
                      auVar154 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190)),auVar166,
                                                 ZEXT416((uint)(fVar199 * -2.0)));
                      fVar190 = auVar153._0_4_ * 0.5;
                      fVar199 = auVar97._0_4_ * 0.5;
                      fVar200 = auVar93._0_4_ * 0.5;
                      fVar201 = auVar154._0_4_ * 0.5;
                      auVar182._0_4_ = fVar201 * (float)local_320;
                      auVar182._4_4_ = fVar201 * local_320._4_4_;
                      auVar182._8_4_ = fVar201 * (float)uStack_318;
                      auVar182._12_4_ = fVar201 * uStack_318._4_4_;
                      auVar205._4_4_ = fVar200;
                      auVar205._0_4_ = fVar200;
                      auVar205._8_4_ = fVar200;
                      auVar205._12_4_ = fVar200;
                      auVar73._4_4_ = fStack_5bc;
                      auVar73._0_4_ = local_5c0;
                      auVar73._8_4_ = fStack_5b8;
                      auVar73._12_4_ = fStack_5b4;
                      auVar93 = vfmadd132ps_fma(auVar205,auVar182,auVar73);
                      auVar183._4_4_ = fVar199;
                      auVar183._0_4_ = fVar199;
                      auVar183._8_4_ = fVar199;
                      auVar183._12_4_ = fVar199;
                      auVar74._8_8_ = uStack_5a8;
                      auVar74._0_8_ = local_5b0;
                      auVar93 = vfmadd132ps_fma(auVar183,auVar93,auVar74);
                      auVar155._4_4_ = fVar190;
                      auVar155._0_4_ = fVar190;
                      auVar155._8_4_ = fVar190;
                      auVar155._12_4_ = fVar190;
                      auVar93 = vfmadd213ps_fma(auVar155,auVar95,auVar93);
                      local_2c0 = auVar93._0_4_;
                      auVar197._8_4_ = 1;
                      auVar197._0_8_ = 0x100000001;
                      auVar197._12_4_ = 1;
                      auVar197._16_4_ = 1;
                      auVar197._20_4_ = 1;
                      auVar197._24_4_ = 1;
                      auVar197._28_4_ = 1;
                      local_2a0 = vpermps_avx2(auVar197,ZEXT1632(auVar93));
                      auVar209._8_4_ = 2;
                      auVar209._0_8_ = 0x200000002;
                      auVar209._12_4_ = 2;
                      auVar209._16_4_ = 2;
                      auVar209._20_4_ = 2;
                      auVar209._24_4_ = 2;
                      auVar209._28_4_ = 2;
                      local_280 = vpermps_avx2(auVar209,ZEXT1632(auVar93));
                      iStack_2bc = local_2c0;
                      iStack_2b8 = local_2c0;
                      iStack_2b4 = local_2c0;
                      iStack_2b0 = local_2c0;
                      iStack_2ac = local_2c0;
                      iStack_2a8 = local_2c0;
                      iStack_2a4 = local_2c0;
                      uStack_23c = local_240;
                      uStack_238 = local_240;
                      uStack_234 = local_240;
                      uStack_230 = local_240;
                      uStack_22c = local_240;
                      uStack_228 = local_240;
                      uStack_224 = local_240;
                      local_220 = local_3a0._0_8_;
                      uStack_218 = local_3a0._8_8_;
                      uStack_210 = local_3a0._16_8_;
                      uStack_208 = local_3a0._24_8_;
                      local_200 = local_380;
                      auVar116 = vpcmpeqd_avx2(local_380,local_380);
                      local_6a8[1] = auVar116;
                      *local_6a8 = auVar116;
                      local_1e0 = (local_6f0.context)->instID[0];
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = (local_6f0.context)->instPrimID[0];
                      uStack_1bc = local_1c0;
                      uStack_1b8 = local_1c0;
                      uStack_1b4 = local_1c0;
                      uStack_1b0 = local_1c0;
                      uStack_1ac = local_1c0;
                      uStack_1a8 = local_1c0;
                      uStack_1a4 = local_1c0;
                      local_5e0 = local_300._0_8_;
                      uStack_5d8 = local_300._8_8_;
                      uStack_5d0 = local_300._16_8_;
                      uStack_5c8 = local_300._24_8_;
                      local_6f0.valid = (int *)&local_5e0;
                      local_6f0.geometryUserPtr = pGVar85->userPtr;
                      local_6f0.hit = (RTCHitN *)&local_2c0;
                      local_6f0.N = 8;
                      local_520._0_4_ = uVar84;
                      local_6f0.ray = (RTCRayN *)ray;
                      if (pGVar85->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar85->intersectionFilterN)(&local_6f0);
                        auVar233 = ZEXT3264(local_660);
                        auVar232 = ZEXT3264(local_640);
                        auVar228 = ZEXT3264(local_6a0);
                        auVar229 = ZEXT3264(local_680);
                        auVar230 = ZEXT3264(local_560);
                        in_ZMM21 = ZEXT3264(local_620);
                        in_ZMM20 = ZEXT3264(local_600);
                        auVar93 = vxorps_avx512vl(auVar96,auVar96);
                        auVar231 = ZEXT1664(auVar93);
                        pGVar85 = local_6b0;
                        uVar84 = local_520._0_4_;
                      }
                      bVar89 = (byte)uVar84;
                      auVar93 = auVar231._0_16_;
                      auVar69._8_8_ = uStack_5d8;
                      auVar69._0_8_ = local_5e0;
                      auVar69._16_8_ = uStack_5d0;
                      auVar69._24_8_ = uStack_5c8;
                      if (auVar69 == (undefined1  [32])0x0) {
LAB_01b67d3f:
                        *(undefined4 *)(ray + k * 4 + 0x100) = local_5a0;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar85->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var12)(&local_6f0);
                          bVar89 = local_520[0];
                          auVar233 = ZEXT3264(local_660);
                          auVar232 = ZEXT3264(local_640);
                          auVar228 = ZEXT3264(local_6a0);
                          auVar229 = ZEXT3264(local_680);
                          auVar230 = ZEXT3264(local_560);
                          in_ZMM21 = ZEXT3264(local_620);
                          in_ZMM20 = ZEXT3264(local_600);
                          auVar93 = vxorps_avx512vl(auVar93,auVar93);
                          auVar231 = ZEXT1664(auVar93);
                          pGVar85 = local_6b0;
                        }
                        auVar70._8_8_ = uStack_5d8;
                        auVar70._0_8_ = local_5e0;
                        auVar70._16_8_ = uStack_5d0;
                        auVar70._24_8_ = uStack_5c8;
                        if (auVar70 == (undefined1  [32])0x0) goto LAB_01b67d3f;
                        uVar83 = vptestmd_avx512vl(auVar70,auVar70);
                        iVar1 = *(int *)(local_6f0.hit + 4);
                        iVar2 = *(int *)(local_6f0.hit + 8);
                        iVar60 = *(int *)(local_6f0.hit + 0xc);
                        iVar61 = *(int *)(local_6f0.hit + 0x10);
                        iVar62 = *(int *)(local_6f0.hit + 0x14);
                        iVar63 = *(int *)(local_6f0.hit + 0x18);
                        iVar64 = *(int *)(local_6f0.hit + 0x1c);
                        bVar79 = (byte)uVar83;
                        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
                        bVar19 = SUB81(uVar83 >> 7,0);
                        *(uint *)(local_6f0.ray + 0x180) =
                             (uint)(bVar79 & 1) * *(int *)local_6f0.hit |
                             (uint)!(bool)(bVar79 & 1) * *(int *)(local_6f0.ray + 0x180);
                        *(uint *)(local_6f0.ray + 0x184) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_6f0.ray + 0x184);
                        *(uint *)(local_6f0.ray + 0x188) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_6f0.ray + 0x188);
                        *(uint *)(local_6f0.ray + 0x18c) =
                             (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_6f0.ray + 0x18c)
                        ;
                        *(uint *)(local_6f0.ray + 400) =
                             (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_6f0.ray + 400);
                        *(uint *)(local_6f0.ray + 0x194) =
                             (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_6f0.ray + 0x194)
                        ;
                        *(uint *)(local_6f0.ray + 0x198) =
                             (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_6f0.ray + 0x198)
                        ;
                        *(uint *)(local_6f0.ray + 0x19c) =
                             (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_6f0.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_6f0.hit + 0x24);
                        iVar2 = *(int *)(local_6f0.hit + 0x28);
                        iVar60 = *(int *)(local_6f0.hit + 0x2c);
                        iVar61 = *(int *)(local_6f0.hit + 0x30);
                        iVar62 = *(int *)(local_6f0.hit + 0x34);
                        iVar63 = *(int *)(local_6f0.hit + 0x38);
                        iVar64 = *(int *)(local_6f0.hit + 0x3c);
                        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
                        bVar19 = SUB81(uVar83 >> 7,0);
                        *(uint *)(local_6f0.ray + 0x1a0) =
                             (uint)(bVar79 & 1) * *(int *)(local_6f0.hit + 0x20) |
                             (uint)!(bool)(bVar79 & 1) * *(int *)(local_6f0.ray + 0x1a0);
                        *(uint *)(local_6f0.ray + 0x1a4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_6f0.ray + 0x1a4);
                        *(uint *)(local_6f0.ray + 0x1a8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_6f0.ray + 0x1a8);
                        *(uint *)(local_6f0.ray + 0x1ac) =
                             (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_6f0.ray + 0x1ac)
                        ;
                        *(uint *)(local_6f0.ray + 0x1b0) =
                             (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_6f0.ray + 0x1b0)
                        ;
                        *(uint *)(local_6f0.ray + 0x1b4) =
                             (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_6f0.ray + 0x1b4)
                        ;
                        *(uint *)(local_6f0.ray + 0x1b8) =
                             (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_6f0.ray + 0x1b8)
                        ;
                        *(uint *)(local_6f0.ray + 0x1bc) =
                             (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_6f0.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_6f0.hit + 0x44);
                        iVar2 = *(int *)(local_6f0.hit + 0x48);
                        iVar60 = *(int *)(local_6f0.hit + 0x4c);
                        iVar61 = *(int *)(local_6f0.hit + 0x50);
                        iVar62 = *(int *)(local_6f0.hit + 0x54);
                        iVar63 = *(int *)(local_6f0.hit + 0x58);
                        iVar64 = *(int *)(local_6f0.hit + 0x5c);
                        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
                        bVar19 = SUB81(uVar83 >> 7,0);
                        *(uint *)(local_6f0.ray + 0x1c0) =
                             (uint)(bVar79 & 1) * *(int *)(local_6f0.hit + 0x40) |
                             (uint)!(bool)(bVar79 & 1) * *(int *)(local_6f0.ray + 0x1c0);
                        *(uint *)(local_6f0.ray + 0x1c4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_6f0.ray + 0x1c4);
                        *(uint *)(local_6f0.ray + 0x1c8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_6f0.ray + 0x1c8);
                        *(uint *)(local_6f0.ray + 0x1cc) =
                             (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_6f0.ray + 0x1cc)
                        ;
                        *(uint *)(local_6f0.ray + 0x1d0) =
                             (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_6f0.ray + 0x1d0)
                        ;
                        *(uint *)(local_6f0.ray + 0x1d4) =
                             (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_6f0.ray + 0x1d4)
                        ;
                        *(uint *)(local_6f0.ray + 0x1d8) =
                             (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_6f0.ray + 0x1d8)
                        ;
                        *(uint *)(local_6f0.ray + 0x1dc) =
                             (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_6f0.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_6f0.hit + 100);
                        iVar2 = *(int *)(local_6f0.hit + 0x68);
                        iVar60 = *(int *)(local_6f0.hit + 0x6c);
                        iVar61 = *(int *)(local_6f0.hit + 0x70);
                        iVar62 = *(int *)(local_6f0.hit + 0x74);
                        iVar63 = *(int *)(local_6f0.hit + 0x78);
                        iVar64 = *(int *)(local_6f0.hit + 0x7c);
                        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
                        bVar19 = SUB81(uVar83 >> 7,0);
                        *(uint *)(local_6f0.ray + 0x1e0) =
                             (uint)(bVar79 & 1) * *(int *)(local_6f0.hit + 0x60) |
                             (uint)!(bool)(bVar79 & 1) * *(int *)(local_6f0.ray + 0x1e0);
                        *(uint *)(local_6f0.ray + 0x1e4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_6f0.ray + 0x1e4);
                        *(uint *)(local_6f0.ray + 0x1e8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_6f0.ray + 0x1e8);
                        *(uint *)(local_6f0.ray + 0x1ec) =
                             (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_6f0.ray + 0x1ec)
                        ;
                        *(uint *)(local_6f0.ray + 0x1f0) =
                             (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_6f0.ray + 0x1f0)
                        ;
                        *(uint *)(local_6f0.ray + 500) =
                             (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_6f0.ray + 500);
                        *(uint *)(local_6f0.ray + 0x1f8) =
                             (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_6f0.ray + 0x1f8)
                        ;
                        *(uint *)(local_6f0.ray + 0x1fc) =
                             (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_6f0.ray + 0x1fc)
                        ;
                        iVar1 = *(int *)(local_6f0.hit + 0x84);
                        iVar2 = *(int *)(local_6f0.hit + 0x88);
                        iVar60 = *(int *)(local_6f0.hit + 0x8c);
                        iVar61 = *(int *)(local_6f0.hit + 0x90);
                        iVar62 = *(int *)(local_6f0.hit + 0x94);
                        iVar63 = *(int *)(local_6f0.hit + 0x98);
                        iVar64 = *(int *)(local_6f0.hit + 0x9c);
                        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
                        bVar19 = SUB81(uVar83 >> 7,0);
                        *(uint *)(local_6f0.ray + 0x200) =
                             (uint)(bVar79 & 1) * *(int *)(local_6f0.hit + 0x80) |
                             (uint)!(bool)(bVar79 & 1) * *(int *)(local_6f0.ray + 0x200);
                        *(uint *)(local_6f0.ray + 0x204) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_6f0.ray + 0x204);
                        *(uint *)(local_6f0.ray + 0x208) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_6f0.ray + 0x208);
                        *(uint *)(local_6f0.ray + 0x20c) =
                             (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_6f0.ray + 0x20c)
                        ;
                        *(uint *)(local_6f0.ray + 0x210) =
                             (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_6f0.ray + 0x210)
                        ;
                        *(uint *)(local_6f0.ray + 0x214) =
                             (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_6f0.ray + 0x214)
                        ;
                        *(uint *)(local_6f0.ray + 0x218) =
                             (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_6f0.ray + 0x218)
                        ;
                        *(uint *)(local_6f0.ray + 0x21c) =
                             (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_6f0.ray + 0x21c)
                        ;
                        auVar116 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_6f0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_6f0.ray + 0x220) = auVar116;
                        auVar116 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_6f0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_6f0.ray + 0x240) = auVar116;
                        auVar116 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_6f0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_6f0.ray + 0x260) = auVar116;
                        auVar116 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_6f0.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_6f0.ray + 0x280) = auVar116;
                      }
                      bVar89 = ~(byte)(1 << ((uint)uVar80 & 0x1f)) & bVar89;
                      uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
                      auVar35._4_4_ = uVar149;
                      auVar35._0_4_ = uVar149;
                      auVar35._8_4_ = uVar149;
                      auVar35._12_4_ = uVar149;
                      auVar35._16_4_ = uVar149;
                      auVar35._20_4_ = uVar149;
                      auVar35._24_4_ = uVar149;
                      auVar35._28_4_ = uVar149;
                      uVar164 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar35,2);
                      bVar79 = bVar89 & (byte)uVar164;
                      uVar84 = (uint)bVar79;
                      if ((bVar89 & (byte)uVar164) != 0) {
                        auVar162._8_4_ = 0x7f800000;
                        auVar162._0_8_ = 0x7f8000007f800000;
                        auVar162._12_4_ = 0x7f800000;
                        auVar162._16_4_ = 0x7f800000;
                        auVar162._20_4_ = 0x7f800000;
                        auVar162._24_4_ = 0x7f800000;
                        auVar162._28_4_ = 0x7f800000;
                        auVar116 = vblendmps_avx512vl(auVar162,in_ZMM21._0_32_);
                        auVar137._0_4_ =
                             (uint)(bVar79 & 1) * auVar116._0_4_ |
                             (uint)!(bool)(bVar79 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar79 >> 1 & 1);
                        auVar137._4_4_ = (uint)bVar13 * auVar116._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar79 >> 2 & 1);
                        auVar137._8_4_ = (uint)bVar13 * auVar116._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar79 >> 3 & 1);
                        auVar137._12_4_ =
                             (uint)bVar13 * auVar116._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar79 >> 4 & 1);
                        auVar137._16_4_ =
                             (uint)bVar13 * auVar116._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar79 >> 5 & 1);
                        auVar137._20_4_ =
                             (uint)bVar13 * auVar116._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar79 >> 6 & 1);
                        auVar137._24_4_ =
                             (uint)bVar13 * auVar116._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar137._28_4_ =
                             (uint)(bVar79 >> 7) * auVar116._28_4_ |
                             (uint)!(bool)(bVar79 >> 7) * 0x7f800000;
                        auVar116 = vshufps_avx(auVar137,auVar137,0xb1);
                        auVar116 = vminps_avx(auVar137,auVar116);
                        auVar117 = vshufpd_avx(auVar116,auVar116,5);
                        auVar116 = vminps_avx(auVar116,auVar117);
                        auVar117 = vpermpd_avx2(auVar116,0x4e);
                        auVar116 = vminps_avx(auVar116,auVar117);
                        uVar164 = vcmpps_avx512vl(auVar137,auVar116,0);
                        bVar89 = (byte)uVar164 & bVar79;
                        uVar82 = uVar84;
                        if (bVar89 != 0) {
                          uVar82 = (uint)bVar89;
                        }
                        uVar81 = 0;
                        for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
                          uVar81 = uVar81 + 1;
                        }
                        uVar80 = (ulong)uVar81;
                      }
                    } while (bVar79 != 0);
                  }
                }
              }
            }
          }
          auVar214 = ZEXT3264(auVar186);
          auVar188 = ZEXT3264(auVar125);
          lVar87 = lVar87 + 8;
        } while ((int)lVar87 < iVar10);
      }
      uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar27._4_4_ = uVar149;
      auVar27._0_4_ = uVar149;
      auVar27._8_4_ = uVar149;
      auVar27._12_4_ = uVar149;
      uVar24 = vcmpps_avx512vl(local_310,auVar27,2);
      uVar86 = (uint)uVar88 & (uint)uVar24;
      uVar88 = (ulong)uVar86;
    } while (uVar86 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }